

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

void embree::sse2::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  AffineSpace3ff *pAVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  BBox1f BVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ulong uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  long lVar23;
  long lVar24;
  undefined4 uVar25;
  int iVar26;
  RayQueryContext *pRVar27;
  undefined4 unaff_EBP;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar44;
  float fVar47;
  undefined1 auVar37 [16];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  uint uVar45;
  uint uVar46;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  uint uVar48;
  uint uVar49;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar77;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar119;
  float fVar121;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar125;
  uint uVar131;
  uint uVar132;
  undefined1 in_XMM4 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar133;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  uint uVar145;
  float fVar149;
  float fVar151;
  undefined1 in_XMM6 [16];
  float fVar153;
  undefined1 auVar146 [16];
  uint uVar150;
  uint uVar152;
  float fVar154;
  uint uVar155;
  float fVar156;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  int iVar157;
  float fVar158;
  float fVar159;
  int iVar164;
  int iVar166;
  undefined1 in_XMM7 [16];
  int iVar168;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar165;
  float fVar167;
  float fVar169;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  float fVar171;
  float fVar179;
  float fVar181;
  undefined1 in_XMM8 [16];
  float fVar183;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar185;
  float fVar190;
  float fVar191;
  undefined1 in_XMM9 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar192;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar193;
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 in_XMM10 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar195 [16];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  undefined1 in_XMM11 [16];
  float fVar207;
  undefined1 auVar204 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 in_XMM12 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar235;
  float fVar238;
  undefined1 in_XMM14 [16];
  float fVar241;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar236;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar244;
  float fVar248;
  float fVar249;
  undefined1 auVar245 [16];
  float fVar250;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  RayQueryContext newcontext;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  RTCIntersectArguments *local_98;
  float local_88;
  float local_78;
  float local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pIVar9 = prim->instance;
  uVar28 = (pIVar9->super_Geometry).mask;
  auVar50._0_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x90)) == 0);
  auVar50._4_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x94)) == 0);
  auVar50._8_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x98)) == 0);
  auVar50._12_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x9c)) == 0);
  auVar50 = ~auVar50 & (undefined1  [16])valid_i->field_0;
  uVar28 = movmskps(unaff_EBP,auVar50);
  if ((uVar28 != 0) && (pRVar10 = context->user, pRVar10->instID[0] == 0xffffffff)) {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      BVar8 = (pIVar9->super_Geometry).time_range;
      fVar32 = BVar8.lower;
      auVar54._0_4_ = BVar8.upper - fVar32;
      fVar33 = (pIVar9->super_Geometry).fnumTimeSegments;
      _local_2d8 = ZEXT416((uint)fVar33);
      auVar127._0_4_ = *(float *)(ray + 0x70) - fVar32;
      auVar127._4_4_ = *(float *)(ray + 0x74) - fVar32;
      auVar127._8_4_ = *(float *)(ray + 0x78) - fVar32;
      auVar127._12_4_ = *(float *)(ray + 0x7c) - fVar32;
      auVar54._4_4_ = auVar54._0_4_;
      auVar54._8_4_ = auVar54._0_4_;
      auVar54._12_4_ = auVar54._0_4_;
      auVar114 = divps(auVar127,auVar54);
      fVar111 = auVar114._0_4_ * fVar33;
      fVar119 = auVar114._4_4_ * fVar33;
      fVar121 = auVar114._8_4_ * fVar33;
      fVar123 = auVar114._12_4_ * fVar33;
      pRVar27 = context;
      local_2b8._0_4_ = floorf(fVar121);
      uVar25 = SUB84(pRVar27,0);
      local_2b8._4_4_ = extraout_XMM0_Db_02;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc_02;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd_02;
      local_2a8._0_4_ = floorf(fVar123);
      local_2a8._4_4_ = extraout_XMM0_Db_03;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_03;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_03;
      local_298._0_4_ = floorf(fVar111);
      local_298._4_4_ = extraout_XMM0_Db_04;
      uStack_290._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_290._4_4_ = (float)extraout_XMM0_Dd_04;
      fVar32 = floorf(fVar119);
      auVar36._4_4_ = fVar32;
      auVar36._0_4_ = local_298._0_4_;
      auVar36._8_4_ = local_2b8._0_4_;
      auVar36._12_4_ = local_2a8._0_4_;
      auVar114._0_4_ = fVar33 + -1.0;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar114 = minps(auVar36,auVar114);
      auVar114 = maxps(auVar114,ZEXT816(0));
      fVar111 = fVar111 - auVar114._0_4_;
      fVar119 = fVar119 - auVar114._4_4_;
      fVar121 = fVar121 - auVar114._8_4_;
      fVar123 = fVar123 - auVar114._12_4_;
      iVar157 = (int)auVar114._0_4_;
      iVar164 = (int)auVar114._4_4_;
      iVar166 = (int)auVar114._8_4_;
      iVar168 = (int)auVar114._12_4_;
      local_a8 = CONCAT44(iVar164,iVar157);
      uStack_a0 = (RTCRayQueryContext *)CONCAT44(iVar168,iVar166);
      lVar23 = 0;
      if ((uVar28 & 0xff) != 0) {
        for (; ((uVar28 & 0xff) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      iVar26 = *(int *)((long)&local_a8 + lVar23 * 4);
      lVar23 = (long)iVar26;
      auVar135._0_4_ = -(uint)(iVar26 == iVar157);
      auVar135._4_4_ = -(uint)(iVar26 == iVar164);
      auVar135._8_4_ = -(uint)(iVar26 == iVar166);
      auVar135._12_4_ = -(uint)(iVar26 == iVar168);
      iVar26 = movmskps(uVar25,~auVar135 & auVar50);
      auVar114 = auVar50;
      if (iVar26 == 0) {
        pAVar12 = pIVar9->local2world;
        pAVar2 = pAVar12 + lVar23;
        fVar108 = (pAVar2->l).vx.field_0.m128[1];
        fVar112 = (pAVar2->l).vx.field_0.m128[2];
        fVar32 = (pAVar2->l).vx.field_0.m128[3];
        pVVar3 = &pAVar12[lVar23].p;
        fVar206 = (pVVar3->field_0).m128[1];
        fVar207 = (pVVar3->field_0).m128[2];
        fVar33 = *(float *)((long)&pVVar3->field_0 + 0xc);
        pAVar11 = pAVar12 + lVar23 + 1;
        fVar109 = (pAVar11->l).vx.field_0.m128[1];
        fVar208 = (pAVar11->l).vx.field_0.m128[2];
        fVar44 = (pAVar11->l).vx.field_0.m128[3];
        pVVar4 = &pAVar12[lVar23 + 1].p;
        fVar210 = (pVVar4->field_0).m128[1];
        local_1e8._0_4_ = (pVVar4->field_0).m128[2];
        fVar77 = *(float *)((long)&pVVar4->field_0 + 0xc);
        pVVar5 = &pAVar12[lVar23].l.vy;
        fVar212 = (pVVar5->field_0).m128[1];
        fVar214 = (pVVar5->field_0).m128[2];
        fVar47 = *(float *)((long)&pVVar5->field_0 + 0xc);
        pVVar6 = &pAVar12[lVar23 + 1].l.vy;
        fVar216 = (pVVar6->field_0).m128[1];
        fVar220 = (pVVar6->field_0).m128[2];
        fVar183 = *(float *)((long)&pVVar6->field_0 + 0xc);
        pVVar7 = &pAVar12[lVar23].l.vz;
        fVar222 = (pVVar7->field_0).m128[0];
        fVar225 = (pVVar7->field_0).m128[1];
        fVar227 = (pVVar7->field_0).m128[2];
        fVar154 = (pVVar7->field_0).m128[3];
        pVVar7 = &pAVar12[lVar23 + 1].l.vz;
        fVar235 = (pVVar7->field_0).m128[1];
        fVar238 = (pVVar7->field_0).m128[2];
        fVar223 = *(float *)((long)&pVVar7->field_0 + 0xc);
        auVar136._0_4_ = fVar154 * fVar223 + fVar47 * fVar183 + fVar32 * fVar44 + fVar33 * fVar77;
        auVar136._4_4_ = fVar154 * fVar223 + fVar47 * fVar183 + fVar32 * fVar44 + fVar33 * fVar77;
        auVar136._8_4_ = fVar154 * fVar223 + fVar47 * fVar183 + fVar32 * fVar44 + fVar33 * fVar77;
        auVar136._12_4_ = fVar154 * fVar223 + fVar47 * fVar183 + fVar32 * fVar44 + fVar33 * fVar77;
        uVar16 = CONCAT44(auVar136._4_4_,auVar136._0_4_);
        auVar174._0_8_ = uVar16 ^ 0x8000000080000000;
        auVar174._8_4_ = -auVar136._8_4_;
        auVar174._12_4_ = -auVar136._12_4_;
        uVar28 = -(uint)(-auVar136._0_4_ <= auVar136._0_4_);
        uVar29 = -(uint)(-auVar136._4_4_ <= auVar136._4_4_);
        uVar30 = -(uint)(auVar174._8_4_ <= auVar136._8_4_);
        uVar31 = -(uint)(auVar174._12_4_ <= auVar136._12_4_);
        fVar124 = (float)((uint)fVar77 & uVar28 | ~uVar28 & (uint)-fVar77);
        fVar144 = (float)((uint)fVar77 & uVar29 | ~uVar29 & (uint)-fVar77);
        fVar149 = (float)((uint)fVar77 & uVar30 | ~uVar30 & (uint)-fVar77);
        fVar151 = (float)((uint)fVar77 & uVar31 | ~uVar31 & (uint)-fVar77);
        fVar170 = (float)((uint)fVar44 & uVar28 | ~uVar28 & (uint)-fVar44);
        fVar241 = (float)((uint)fVar44 & uVar29 | ~uVar29 & (uint)-fVar44);
        fVar248 = (float)((uint)fVar44 & uVar30 | ~uVar30 & (uint)-fVar44);
        fVar250 = (float)((uint)fVar44 & uVar31 | ~uVar31 & (uint)-fVar44);
        fVar171 = (float)((uint)fVar183 & uVar28 | ~uVar28 & (uint)-fVar183);
        fVar180 = (float)((uint)fVar183 & uVar29 | ~uVar29 & (uint)-fVar183);
        fVar182 = (float)((uint)fVar183 & uVar30 | ~uVar30 & (uint)-fVar183);
        fVar184 = (float)((uint)fVar183 & uVar31 | ~uVar31 & (uint)-fVar183);
        auVar54 = maxps(auVar174,auVar136);
        fVar203 = ABS(auVar136._0_4_);
        fVar75 = ABS(auVar136._4_4_);
        fVar76 = ABS(auVar136._8_4_);
        fVar78 = ABS(auVar136._12_4_);
        local_48 = (float)(~uVar28 & (uint)-fVar223 | (uint)fVar223 & uVar28);
        fStack_44 = (float)(~uVar29 & (uint)-fVar223 | (uint)fVar223 & uVar29);
        fStack_40 = (float)(~uVar30 & (uint)-fVar223 | (uint)fVar223 & uVar30);
        fStack_3c = (float)(~uVar31 & (uint)-fVar223 | (uint)fVar223 & uVar31);
        auVar55._0_4_ = 1.0 - fVar203;
        auVar55._4_4_ = 1.0 - fVar75;
        auVar55._8_4_ = 1.0 - fVar76;
        auVar55._12_4_ = 1.0 - fVar78;
        auVar114 = sqrtps(auVar55,auVar55);
        fVar44 = 1.5707964 -
                 auVar114._0_4_ *
                 (((((fVar203 * -0.0043095737 + 0.0192803) * fVar203 + -0.04489909) * fVar203 +
                   0.08785567) * fVar203 + -0.21450998) * fVar203 + 1.5707952);
        fVar77 = 1.5707964 -
                 auVar114._4_4_ *
                 (((((fVar75 * -0.0043095737 + 0.0192803) * fVar75 + -0.04489909) * fVar75 +
                   0.08785567) * fVar75 + -0.21450998) * fVar75 + 1.5707952);
        fVar183 = 1.5707964 -
                  auVar114._8_4_ *
                  (((((fVar76 * -0.0043095737 + 0.0192803) * fVar76 + -0.04489909) * fVar76 +
                    0.08785567) * fVar76 + -0.21450998) * fVar76 + 1.5707952);
        fVar223 = 1.5707964 -
                  auVar114._12_4_ *
                  (((((fVar78 * -0.0043095737 + 0.0192803) * fVar78 + -0.04489909) * fVar78 +
                    0.08785567) * fVar78 + -0.21450998) * fVar78 + 1.5707952);
        uVar28 = -(uint)(0.0 <= fVar44) & (uint)fVar44;
        uVar29 = -(uint)(0.0 <= fVar77) & (uint)fVar77;
        uVar30 = -(uint)(0.0 <= fVar183) & (uint)fVar183;
        uVar31 = -(uint)(0.0 <= fVar223) & (uint)fVar223;
        fVar194 = auVar54._0_4_;
        fVar197 = auVar54._4_4_;
        fVar199 = auVar54._8_4_;
        fVar201 = auVar54._12_4_;
        local_248._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar2->l).vx.field_0,0);
        local_238._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        local_2b8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        local_168._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,0);
        local_148._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,0);
        local_1f8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,0);
        local_178._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_58 = (float)(~-(uint)(fVar203 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar194) & (uVar28 ^ 0x80000000) |
                                       uVar28 & -(uint)(0.0 <= fVar194))) & -(uint)(fVar203 <= 1.0))
                   * fVar111;
        fStack_54 = (float)(~-(uint)(fVar75 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar197) & (uVar29 ^ 0x80000000) |
                                        uVar29 & -(uint)(0.0 <= fVar197))) & -(uint)(fVar75 <= 1.0))
                    * fVar119;
        fStack_50 = (float)(~-(uint)(fVar76 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar199) & (uVar30 ^ 0x80000000) |
                                        uVar30 & -(uint)(0.0 <= fVar199))) & -(uint)(fVar76 <= 1.0))
                    * fVar121;
        fStack_4c = (float)(~-(uint)(fVar78 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar201) & (uVar31 ^ 0x80000000) |
                                        uVar31 & -(uint)(0.0 <= fVar201))) & -(uint)(fVar78 <= 1.0))
                    * fVar123;
        fVar44 = local_58 * 0.63661975;
        fVar77 = fStack_54 * 0.63661975;
        fVar183 = fStack_4c * 0.63661975;
        local_68 = floorf(fStack_50 * 0.63661975);
        local_78 = floorf(fVar183);
        local_88 = floorf(fVar44);
        fVar44 = floorf(fVar77);
        uVar28 = (uint)local_88;
        uVar30 = (uint)fVar44;
        uVar45 = (uint)local_68;
        uVar48 = (uint)local_78;
        fVar77 = local_58 - local_88 * 1.5707964;
        fVar44 = fStack_54 - fVar44 * 1.5707964;
        auVar175._4_4_ = fVar44;
        auVar175._0_4_ = fVar77;
        fVar183 = fStack_50 - local_68 * 1.5707964;
        fVar223 = fStack_4c - local_78 * 1.5707964;
        auVar175._8_4_ = fVar183;
        auVar175._12_4_ = fVar223;
        fVar203 = fVar77 * fVar77;
        fVar75 = fVar44 * fVar44;
        fVar76 = fVar183 * fVar183;
        fVar78 = fVar223 * fVar223;
        uVar145 = -(uint)(1 < (uVar28 & 3));
        uVar150 = -(uint)(1 < (uVar30 & 3));
        uVar152 = -(uint)(1 < (uVar45 & 3));
        uVar155 = -(uint)(1 < (uVar48 & 3));
        fVar77 = (((((fVar203 * -2.5029328e-08 + 2.7600126e-06) * fVar203 + -0.00019842605) *
                    fVar203 + 0.008333348) * fVar203 + -0.16666667) * fVar203 + 1.0) * fVar77;
        fVar44 = (((((fVar75 * -2.5029328e-08 + 2.7600126e-06) * fVar75 + -0.00019842605) * fVar75 +
                   0.008333348) * fVar75 + -0.16666667) * fVar75 + 1.0) * fVar44;
        fVar183 = (((((fVar76 * -2.5029328e-08 + 2.7600126e-06) * fVar76 + -0.00019842605) * fVar76
                    + 0.008333348) * fVar76 + -0.16666667) * fVar76 + 1.0) * fVar183;
        fVar223 = (((((fVar78 * -2.5029328e-08 + 2.7600126e-06) * fVar78 + -0.00019842605) * fVar78
                    + 0.008333348) * fVar78 + -0.16666667) * fVar78 + 1.0) * fVar223;
        uVar29 = -(uint)((uVar28 & 1) == 0);
        uVar31 = -(uint)((uVar30 & 1) == 0);
        uVar46 = -(uint)((uVar45 & 1) == 0);
        uVar49 = -(uint)((uVar48 & 1) == 0);
        fVar203 = ((((fVar203 * -2.5963018e-07 + 2.4756235e-05) * fVar203 + -0.001388833) * fVar203
                   + 0.04166664) * fVar203 + -0.5) * fVar203 + 1.0;
        fVar75 = ((((fVar75 * -2.5963018e-07 + 2.4756235e-05) * fVar75 + -0.001388833) * fVar75 +
                  0.04166664) * fVar75 + -0.5) * fVar75 + 1.0;
        fVar76 = ((((fVar76 * -2.5963018e-07 + 2.4756235e-05) * fVar76 + -0.001388833) * fVar76 +
                  0.04166664) * fVar76 + -0.5) * fVar76 + 1.0;
        fVar78 = ((((fVar78 * -2.5963018e-07 + 2.4756235e-05) * fVar78 + -0.001388833) * fVar78 +
                  0.04166664) * fVar78 + -0.5) * fVar78 + 1.0;
        uVar29 = ~uVar29 & (uint)fVar203 | (uint)fVar77 & uVar29;
        uVar31 = ~uVar31 & (uint)fVar75 | (uint)fVar44 & uVar31;
        uVar46 = ~uVar46 & (uint)fVar76 | (uint)fVar183 & uVar46;
        uVar49 = ~uVar49 & (uint)fVar78 | (uint)fVar223 & uVar49;
        uVar125 = (int)(uVar28 << 0x1f) >> 0x1f;
        uVar131 = (int)(uVar30 << 0x1f) >> 0x1f;
        uVar132 = (int)(uVar45 << 0x1f) >> 0x1f;
        uVar133 = (int)(uVar48 << 0x1f) >> 0x1f;
        uVar125 = ~uVar125 & (uint)fVar203 | (uint)fVar77 & uVar125;
        uVar131 = ~uVar131 & (uint)fVar75 | (uint)fVar44 & uVar131;
        uVar132 = ~uVar132 & (uint)fVar76 | (uint)fVar183 & uVar132;
        uVar133 = ~uVar133 & (uint)fVar78 | (uint)fVar223 & uVar133;
        fVar77 = (float)((uVar29 ^ 0x80000000) & uVar145 | ~uVar145 & uVar29);
        fVar110 = (float)((uVar31 ^ 0x80000000) & uVar150 | ~uVar150 & uVar31);
        fVar120 = (float)((uVar46 ^ 0x80000000) & uVar152 | ~uVar152 & uVar46);
        fVar122 = (float)((uVar49 ^ 0x80000000) & uVar155 | ~uVar155 & uVar49);
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar28 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar30 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar45 & 3) - 3 ^ 0x80000000));
        uVar31 = -(uint)(0x7ffffffd < (int)((uVar48 & 3) - 3 ^ 0x80000000));
        fVar209 = (float)((uVar125 ^ 0x80000000) & uVar28 | ~uVar28 & uVar125);
        fVar211 = (float)((uVar131 ^ 0x80000000) & uVar29 | ~uVar29 & uVar131);
        fVar213 = (float)((uVar132 ^ 0x80000000) & uVar30 | ~uVar30 & uVar132);
        fVar215 = (float)((uVar133 ^ 0x80000000) & uVar31 | ~uVar31 & uVar133);
        fVar44 = fVar33 * fVar194 - fVar124;
        fVar183 = fVar33 * fVar197 - fVar144;
        fVar223 = fVar33 * fVar199 - fVar149;
        fVar78 = fVar33 * fVar201 - fVar151;
        fVar153 = fVar32 * fVar194 - fVar170;
        fVar179 = fVar32 * fVar197 - fVar241;
        fVar193 = fVar32 * fVar199 - fVar248;
        fVar202 = fVar32 * fVar201 - fVar250;
        fVar205 = fVar47 * fVar194 - fVar171;
        fVar244 = fVar47 * fVar197 - fVar180;
        fVar249 = fVar47 * fVar199 - fVar182;
        fVar156 = fVar47 * fVar201 - fVar184;
        fVar181 = fVar154 * fVar194 - local_48;
        fVar196 = fVar154 * fVar197 - fStack_44;
        fVar198 = fVar154 * fVar199 - fStack_40;
        fVar200 = fVar154 * fVar201 - fStack_3c;
        auVar80._0_4_ = fVar181 * fVar181 + fVar205 * fVar205 + fVar153 * fVar153 + fVar44 * fVar44;
        auVar80._4_4_ =
             fVar196 * fVar196 + fVar244 * fVar244 + fVar179 * fVar179 + fVar183 * fVar183;
        auVar80._8_4_ =
             fVar198 * fVar198 + fVar249 * fVar249 + fVar193 * fVar193 + fVar223 * fVar223;
        auVar80._12_4_ = fVar200 * fVar200 + fVar156 * fVar156 + fVar202 * fVar202 + fVar78 * fVar78
        ;
        auVar114 = rsqrtps(auVar175,auVar80);
        fVar203 = auVar114._0_4_;
        fVar75 = auVar114._4_4_;
        fVar76 = auVar114._8_4_;
        fVar159 = auVar114._12_4_;
        fVar158 = fVar203 * 1.5 - fVar203 * fVar203 * auVar80._0_4_ * 0.5 * fVar203;
        fVar165 = fVar75 * 1.5 - fVar75 * fVar75 * auVar80._4_4_ * 0.5 * fVar75;
        fVar167 = fVar76 * 1.5 - fVar76 * fVar76 * auVar80._8_4_ * 0.5 * fVar76;
        fVar169 = fVar159 * 1.5 - fVar159 * fVar159 * auVar80._12_4_ * 0.5 * fVar159;
        fVar185 = (fVar124 - fVar33) * fVar111 + fVar33;
        fVar190 = (fVar144 - fVar33) * fVar119 + fVar33;
        fVar191 = (fVar149 - fVar33) * fVar121 + fVar33;
        fVar192 = (fVar151 - fVar33) * fVar123 + fVar33;
        fVar159 = (fVar170 - fVar32) * fVar111 + fVar32;
        fVar241 = (fVar241 - fVar32) * fVar119 + fVar32;
        fVar248 = (fVar248 - fVar32) * fVar121 + fVar32;
        fVar250 = (fVar250 - fVar32) * fVar123 + fVar32;
        fVar171 = (fVar171 - fVar47) * fVar111 + fVar47;
        fVar180 = (fVar180 - fVar47) * fVar119 + fVar47;
        fVar182 = (fVar182 - fVar47) * fVar121 + fVar47;
        fVar184 = (fVar184 - fVar47) * fVar123 + fVar47;
        fVar217 = (local_48 - fVar154) * fVar111 + fVar154;
        fVar221 = (fStack_44 - fVar154) * fVar119 + fVar154;
        fVar224 = (fStack_40 - fVar154) * fVar121 + fVar154;
        fVar226 = (fStack_3c - fVar154) * fVar123 + fVar154;
        auVar137._0_4_ = fVar171 * fVar171 + fVar159 * fVar159 + fVar185 * fVar185;
        auVar137._4_4_ = fVar180 * fVar180 + fVar241 * fVar241 + fVar190 * fVar190;
        auVar137._8_4_ = fVar182 * fVar182 + fVar248 * fVar248 + fVar191 * fVar191;
        auVar137._12_4_ = fVar184 * fVar184 + fVar250 * fVar250 + fVar192 * fVar192;
        auVar147._0_4_ = fVar217 * fVar217 + auVar137._0_4_;
        auVar147._4_4_ = fVar221 * fVar221 + auVar137._4_4_;
        auVar147._8_4_ = fVar224 * fVar224 + auVar137._8_4_;
        auVar147._12_4_ = fVar226 * fVar226 + auVar137._12_4_;
        auVar114 = rsqrtps(auVar137,auVar147);
        fVar203 = auVar114._0_4_;
        fVar75 = auVar114._4_4_;
        fVar76 = auVar114._8_4_;
        fVar149 = auVar114._12_4_;
        fVar124 = fVar203 * 1.5 - fVar203 * fVar203 * auVar147._0_4_ * 0.5 * fVar203;
        fVar144 = fVar75 * 1.5 - fVar75 * fVar75 * auVar147._4_4_ * 0.5 * fVar75;
        fVar151 = fVar76 * 1.5 - fVar76 * fVar76 * auVar147._8_4_ * 0.5 * fVar76;
        fVar170 = fVar149 * 1.5 - fVar149 * fVar149 * auVar147._12_4_ * 0.5 * fVar149;
        uVar28 = -(uint)(fVar194 <= 0.9995);
        uVar29 = -(uint)(fVar197 <= 0.9995);
        uVar30 = -(uint)(fVar199 <= 0.9995);
        uVar31 = -(uint)(fVar201 <= 0.9995);
        fVar203 = (float)(~uVar28 & (uint)(fVar185 * fVar124) |
                         (uint)(fVar33 * fVar209 - fVar44 * fVar158 * fVar77) & uVar28);
        fVar75 = (float)(~uVar29 & (uint)(fVar190 * fVar144) |
                        (uint)(fVar33 * fVar211 - fVar183 * fVar165 * fVar110) & uVar29);
        fVar76 = (float)(~uVar30 & (uint)(fVar191 * fVar151) |
                        (uint)(fVar33 * fVar213 - fVar223 * fVar167 * fVar120) & uVar30);
        fVar78 = (float)(~uVar31 & (uint)(fVar192 * fVar170) |
                        (uint)(fVar33 * fVar215 - fVar78 * fVar169 * fVar122) & uVar31);
        fVar33 = (float)(~uVar28 & (uint)(fVar159 * fVar124) |
                        (uint)(fVar32 * fVar209 - fVar153 * fVar158 * fVar77) & uVar28);
        fVar44 = (float)(~uVar29 & (uint)(fVar241 * fVar144) |
                        (uint)(fVar32 * fVar211 - fVar179 * fVar165 * fVar110) & uVar29);
        fVar183 = (float)(~uVar30 & (uint)(fVar248 * fVar151) |
                         (uint)(fVar32 * fVar213 - fVar193 * fVar167 * fVar120) & uVar30);
        fVar223 = (float)(~uVar31 & (uint)(fVar250 * fVar170) |
                         (uint)(fVar32 * fVar215 - fVar202 * fVar169 * fVar122) & uVar31);
        fVar149 = (float)(~uVar28 & (uint)(fVar171 * fVar124) |
                         (uint)(fVar47 * fVar209 - fVar205 * fVar158 * fVar77) & uVar28);
        fVar153 = (float)(~uVar29 & (uint)(fVar180 * fVar144) |
                         (uint)(fVar47 * fVar211 - fVar244 * fVar165 * fVar110) & uVar29);
        fVar179 = (float)(~uVar30 & (uint)(fVar182 * fVar151) |
                         (uint)(fVar47 * fVar213 - fVar249 * fVar167 * fVar120) & uVar30);
        fVar193 = (float)(~uVar31 & (uint)(fVar184 * fVar170) |
                         (uint)(fVar47 * fVar215 - fVar156 * fVar169 * fVar122) & uVar31);
        fVar32 = (float)(~uVar28 & (uint)(fVar124 * fVar217) |
                        (uint)(fVar209 * fVar154 - fVar158 * fVar181 * fVar77) & uVar28);
        fVar77 = (float)(~uVar29 & (uint)(fVar144 * fVar221) |
                        (uint)(fVar211 * fVar154 - fVar165 * fVar196 * fVar110) & uVar29);
        fVar47 = (float)(~uVar30 & (uint)(fVar151 * fVar224) |
                        (uint)(fVar213 * fVar154 - fVar167 * fVar198 * fVar120) & uVar30);
        fVar154 = (float)(~uVar31 & (uint)(fVar170 * fVar226) |
                         (uint)(fVar215 * fVar154 - fVar169 * fVar200 * fVar122) & uVar31);
        fVar120 = 1.0 - fVar111;
        fVar122 = 1.0 - fVar119;
        fVar124 = 1.0 - fVar121;
        fVar144 = 1.0 - fVar123;
        fVar151 = (float)local_248._0_4_ * fVar120 + (float)local_168._0_4_ * fVar111;
        fVar170 = (float)local_248._0_4_ * fVar122 + (float)local_168._0_4_ * fVar119;
        fVar181 = (float)local_248._0_4_ * fVar124 + (float)local_168._0_4_ * fVar121;
        fVar196 = (float)local_248._0_4_ * fVar144 + (float)local_168._0_4_ * fVar123;
        fVar198 = fVar108 * fVar120 + fVar109 * fVar111;
        fVar200 = fVar108 * fVar122 + fVar109 * fVar119;
        fVar202 = fVar108 * fVar124 + fVar109 * fVar121;
        fVar205 = fVar108 * fVar144 + fVar109 * fVar123;
        fVar108 = fVar112 * fVar120 + fVar208 * fVar111;
        fVar109 = fVar112 * fVar122 + fVar208 * fVar119;
        fVar110 = fVar112 * fVar124 + fVar208 * fVar121;
        fVar112 = fVar112 * fVar144 + fVar208 * fVar123;
        fVar208 = (float)local_238._0_4_ * fVar124;
        fVar241 = (float)local_238._0_4_ * fVar144;
        local_238._4_4_ = (float)local_238._0_4_ * fVar122 + (float)local_148._0_4_ * fVar119;
        local_238._0_4_ = (float)local_238._0_4_ * fVar120 + (float)local_148._0_4_ * fVar111;
        uStack_230._0_4_ = fVar208 + (float)local_148._0_4_ * fVar121;
        uStack_230._4_4_ = fVar241 + (float)local_148._0_4_ * fVar123;
        local_278._4_4_ = fVar212 * fVar122 + fVar216 * fVar119;
        local_278._0_4_ = fVar212 * fVar120 + fVar216 * fVar111;
        fStack_270 = fVar212 * fVar124 + fVar216 * fVar121;
        fStack_26c = fVar212 * fVar144 + fVar216 * fVar123;
        local_2d8._4_4_ = fVar214 * fVar122 + fVar220 * fVar119;
        local_2d8._0_4_ = fVar214 * fVar120 + fVar220 * fVar111;
        uStack_2d0._0_4_ = fVar214 * fVar124 + fVar220 * fVar121;
        uStack_2d0._4_4_ = fVar214 * fVar144 + fVar220 * fVar123;
        local_1c8._4_4_ = fVar222 * fVar122 + (float)local_1f8._0_4_ * fVar119;
        local_1c8._0_4_ = fVar222 * fVar120 + (float)local_1f8._0_4_ * fVar111;
        fStack_1c0 = fVar222 * fVar124 + (float)local_1f8._0_4_ * fVar121;
        fStack_1bc = fVar222 * fVar144 + (float)local_1f8._0_4_ * fVar123;
        local_1d8._4_4_ = fVar225 * fVar122 + fVar235 * fVar119;
        local_1d8._0_4_ = fVar225 * fVar120 + fVar235 * fVar111;
        fStack_1d0 = fVar225 * fVar124 + fVar235 * fVar121;
        fStack_1cc = fVar225 * fVar144 + fVar235 * fVar123;
        local_228._4_4_ = fVar227 * fVar122 + fVar238 * fVar119;
        local_228._0_4_ = fVar227 * fVar120 + fVar238 * fVar111;
        fStack_220 = fVar227 * fVar124 + fVar238 * fVar121;
        fStack_21c = fVar227 * fVar144 + fVar238 * fVar123;
        fVar208 = (float)local_2b8._0_4_ * fVar124;
        fVar212 = (float)local_2b8._0_4_ * fVar144;
        local_2b8._4_4_ = (float)local_2b8._0_4_ * fVar122 + (float)local_178._0_4_ * fVar119;
        local_2b8._0_4_ = (float)local_2b8._0_4_ * fVar120 + (float)local_178._0_4_ * fVar111;
        uStack_2b0._0_4_ = fVar208 + (float)local_178._0_4_ * fVar121;
        uStack_2b0._4_4_ = fVar212 + (float)local_178._0_4_ * fVar123;
        local_2a8._4_4_ = fVar206 * fVar122 + fVar210 * fVar119;
        local_2a8._0_4_ = fVar206 * fVar120 + fVar210 * fVar111;
        uStack_2a0._0_4_ = fVar206 * fVar124 + fVar210 * fVar121;
        uStack_2a0._4_4_ = fVar206 * fVar144 + fVar210 * fVar123;
        fVar120 = fVar120 * fVar207;
        fVar122 = fVar122 * fVar207;
        fVar124 = fVar124 * fVar207;
        fVar144 = fVar144 * fVar207;
        local_1e8._4_4_ = local_1e8._0_4_;
        fStack_1dc = (float)local_1e8._0_4_;
        fStack_1e0 = (float)local_1e8._0_4_;
      }
      else {
        while (uVar28 = movmskps((int)lVar23,auVar114), uVar28 != 0) {
          lVar23 = 0;
          if ((uVar28 & 0xff) != 0) {
            for (; ((uVar28 & 0xff) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          iVar26 = *(int *)((long)&local_a8 + (long)(int)lVar23 * 4);
          lVar24 = (long)iVar26;
          auVar117._0_4_ = -(uint)(iVar26 == iVar157);
          auVar117._4_4_ = -(uint)(iVar26 == iVar164);
          auVar117._8_4_ = -(uint)(iVar26 == iVar166);
          auVar117._12_4_ = -(uint)(iVar26 == iVar168);
          auVar117 = auVar117 & auVar114;
          pAVar11 = pIVar9->local2world;
          lVar23 = lVar24 * 0x40;
          pAVar2 = pAVar11 + lVar24;
          uVar25 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar13 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 0xc);
          auVar85._4_4_ = uVar25;
          auVar85._0_4_ = uVar25;
          auVar85._8_4_ = uVar25;
          auVar85._12_4_ = uVar25;
          _local_248 = ~auVar117 & _local_248 | auVar85 & auVar117;
          auVar86._4_4_ = uVar13;
          auVar86._0_4_ = uVar13;
          auVar86._8_4_ = uVar13;
          auVar86._12_4_ = uVar13;
          _local_218 = ~auVar117 & _local_218 | auVar86 & auVar117;
          auVar87._4_4_ = uVar14;
          auVar87._0_4_ = uVar14;
          auVar87._8_4_ = uVar14;
          auVar87._12_4_ = uVar14;
          _local_298 = ~auVar117 & _local_298 | auVar87 & auVar117;
          auVar161._4_4_ = uVar15;
          auVar161._0_4_ = uVar15;
          auVar161._8_4_ = uVar15;
          auVar161._12_4_ = uVar15;
          in_XMM7 = ~auVar117 & in_XMM7 | auVar161 & auVar117;
          pVVar3 = &pAVar11[lVar24].l.vy;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar88._4_4_ = uVar25;
          auVar88._0_4_ = uVar25;
          auVar88._8_4_ = uVar25;
          auVar88._12_4_ = uVar25;
          _local_238 = ~auVar117 & _local_238 | auVar88 & auVar117;
          auVar89._4_4_ = uVar13;
          auVar89._0_4_ = uVar13;
          auVar89._8_4_ = uVar13;
          auVar89._12_4_ = uVar13;
          _local_278 = ~auVar117 & _local_278 | auVar89 & auVar117;
          auVar90._4_4_ = uVar14;
          auVar90._0_4_ = uVar14;
          auVar90._8_4_ = uVar14;
          auVar90._12_4_ = uVar14;
          _local_2d8 = ~auVar117 & _local_2d8 | auVar90 & auVar117;
          auVar173._4_4_ = uVar15;
          auVar173._0_4_ = uVar15;
          auVar173._8_4_ = uVar15;
          auVar173._12_4_ = uVar15;
          in_XMM6 = ~auVar117 & in_XMM6 | auVar173 & auVar117;
          pVVar3 = &pAVar11[lVar24].l.vz;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar91._4_4_ = uVar25;
          auVar91._0_4_ = uVar25;
          auVar91._8_4_ = uVar25;
          auVar91._12_4_ = uVar25;
          _local_1c8 = ~auVar117 & _local_1c8 | auVar91 & auVar117;
          auVar92._4_4_ = uVar13;
          auVar92._0_4_ = uVar13;
          auVar92._8_4_ = uVar13;
          auVar92._12_4_ = uVar13;
          _local_1d8 = ~auVar117 & _local_1d8 | auVar92 & auVar117;
          auVar93._4_4_ = uVar14;
          auVar93._0_4_ = uVar14;
          auVar93._8_4_ = uVar14;
          auVar93._12_4_ = uVar14;
          _local_228 = ~auVar117 & _local_228 | auVar93 & auVar117;
          auVar187._4_4_ = uVar15;
          auVar187._0_4_ = uVar15;
          auVar187._8_4_ = uVar15;
          auVar187._12_4_ = uVar15;
          in_XMM5 = ~auVar117 & in_XMM5 | auVar187 & auVar117;
          pVVar3 = &pAVar11[lVar24].p;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar94._4_4_ = uVar25;
          auVar94._0_4_ = uVar25;
          auVar94._8_4_ = uVar25;
          auVar94._12_4_ = uVar25;
          _local_2b8 = ~auVar117 & _local_2b8 | auVar94 & auVar117;
          auVar95._4_4_ = uVar13;
          auVar95._0_4_ = uVar13;
          auVar95._8_4_ = uVar13;
          auVar95._12_4_ = uVar13;
          _local_2a8 = ~auVar117 & _local_2a8 | auVar95 & auVar117;
          auVar96._4_4_ = uVar14;
          auVar96._0_4_ = uVar14;
          auVar96._8_4_ = uVar14;
          auVar96._12_4_ = uVar14;
          _local_b8 = ~auVar117 & _local_b8 | auVar96 & auVar117;
          auVar231._4_4_ = uVar15;
          auVar231._0_4_ = uVar15;
          auVar231._8_4_ = uVar15;
          auVar231._12_4_ = uVar15;
          in_XMM4 = ~auVar117 & in_XMM4 | auVar231 & auVar117;
          pAVar2 = pAVar11 + lVar24 + 1;
          uVar25 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar13 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 0xc);
          auVar97._4_4_ = uVar25;
          auVar97._0_4_ = uVar25;
          auVar97._8_4_ = uVar25;
          auVar97._12_4_ = uVar25;
          _local_f8 = ~auVar117 & _local_f8 | auVar97 & auVar117;
          auVar98._4_4_ = uVar13;
          auVar98._0_4_ = uVar13;
          auVar98._8_4_ = uVar13;
          auVar98._12_4_ = uVar13;
          _local_e8 = ~auVar117 & _local_e8 | auVar98 & auVar117;
          auVar99._4_4_ = uVar14;
          auVar99._0_4_ = uVar14;
          auVar99._8_4_ = uVar14;
          auVar99._12_4_ = uVar14;
          _local_d8 = ~auVar117 & _local_d8 | auVar99 & auVar117;
          auVar70._4_4_ = uVar15;
          auVar70._0_4_ = uVar15;
          auVar70._8_4_ = uVar15;
          auVar70._12_4_ = uVar15;
          _local_288 = ~auVar117 & _local_288 | auVar70 & auVar117;
          pVVar3 = &pAVar11[lVar24 + 1].l.vy;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar100._4_4_ = uVar25;
          auVar100._0_4_ = uVar25;
          auVar100._8_4_ = uVar25;
          auVar100._12_4_ = uVar25;
          _local_1a8 = ~auVar117 & _local_1a8 | auVar100 & auVar117;
          auVar101._4_4_ = uVar13;
          auVar101._0_4_ = uVar13;
          auVar101._8_4_ = uVar13;
          auVar101._12_4_ = uVar13;
          _local_198 = ~auVar117 & _local_198 | auVar101 & auVar117;
          auVar102._4_4_ = uVar14;
          auVar102._0_4_ = uVar14;
          auVar102._8_4_ = uVar14;
          auVar102._12_4_ = uVar14;
          _local_188 = ~auVar117 & _local_188 | auVar102 & auVar117;
          auVar71._4_4_ = uVar15;
          auVar71._0_4_ = uVar15;
          auVar71._8_4_ = uVar15;
          auVar71._12_4_ = uVar15;
          _local_268 = ~auVar117 & _local_268 | auVar71 & auVar117;
          pVVar3 = &pAVar11[lVar24 + 1].l.vz;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar103._4_4_ = uVar25;
          auVar103._0_4_ = uVar25;
          auVar103._8_4_ = uVar25;
          auVar103._12_4_ = uVar25;
          _local_178 = ~auVar117 & _local_178 | auVar103 & auVar117;
          auVar104._4_4_ = uVar13;
          auVar104._0_4_ = uVar13;
          auVar104._8_4_ = uVar13;
          auVar104._12_4_ = uVar13;
          _local_168 = ~auVar117 & _local_168 | auVar104 & auVar117;
          auVar105._4_4_ = uVar14;
          auVar105._0_4_ = uVar14;
          auVar105._8_4_ = uVar14;
          auVar105._12_4_ = uVar14;
          _local_158 = ~auVar117 & _local_158 | auVar105 & auVar117;
          auVar72._4_4_ = uVar15;
          auVar72._0_4_ = uVar15;
          auVar72._8_4_ = uVar15;
          auVar72._12_4_ = uVar15;
          _local_208 = ~auVar117 & _local_208 | auVar72 & auVar117;
          pVVar3 = &pAVar11[lVar24 + 1].p;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar106._4_4_ = uVar25;
          auVar106._0_4_ = uVar25;
          auVar106._8_4_ = uVar25;
          auVar106._12_4_ = uVar25;
          _local_148 = ~auVar117 & _local_148 | auVar106 & auVar117;
          auVar247._4_4_ = uVar13;
          auVar247._0_4_ = uVar13;
          auVar247._8_4_ = uVar13;
          auVar247._12_4_ = uVar13;
          _local_1f8 = ~auVar117 & _local_1f8 | auVar247 & auVar117;
          auVar234._4_4_ = uVar14;
          auVar234._0_4_ = uVar14;
          auVar234._8_4_ = uVar14;
          auVar234._12_4_ = uVar14;
          _local_1e8 = ~auVar117 & _local_1e8 | auVar234 & auVar117;
          auVar73._4_4_ = uVar15;
          auVar73._0_4_ = uVar15;
          auVar73._8_4_ = uVar15;
          auVar73._12_4_ = uVar15;
          _local_258 = ~auVar117 & _local_258 | auVar73 & auVar117;
          auVar114 = auVar114 ^ auVar117;
        }
        fVar149 = in_XMM4._0_4_;
        fVar153 = in_XMM4._4_4_;
        fVar179 = in_XMM4._8_4_;
        fVar193 = in_XMM4._12_4_;
        fVar238 = in_XMM7._0_4_;
        fVar244 = in_XMM7._4_4_;
        fVar249 = in_XMM7._8_4_;
        fVar156 = in_XMM7._12_4_;
        fVar212 = in_XMM6._0_4_;
        fVar216 = in_XMM6._4_4_;
        fVar222 = in_XMM6._8_4_;
        fVar227 = in_XMM6._12_4_;
        fVar198 = in_XMM5._0_4_;
        fVar202 = in_XMM5._4_4_;
        fVar206 = in_XMM5._8_4_;
        fVar208 = in_XMM5._12_4_;
        auVar43._0_4_ =
             (float)local_208._0_4_ * fVar198 +
             (float)local_268._0_4_ * fVar212 +
             (float)local_288._0_4_ * fVar238 + (float)local_258._0_4_ * fVar149;
        auVar43._4_4_ =
             (float)local_208._4_4_ * fVar202 +
             (float)local_268._4_4_ * fVar216 +
             (float)local_288._4_4_ * fVar244 + (float)local_258._4_4_ * fVar153;
        auVar43._8_4_ =
             fStack_200 * fVar206 +
             fStack_260 * fVar222 + fStack_280 * fVar249 + fStack_250 * fVar179;
        auVar43._12_4_ =
             fStack_1fc * fVar208 +
             fStack_25c * fVar227 + fStack_27c * fVar156 + fStack_24c * fVar193;
        uVar16 = CONCAT44(auVar43._4_4_,auVar43._0_4_);
        auVar74._0_8_ = uVar16 ^ 0x8000000080000000;
        auVar74._8_4_ = -auVar43._8_4_;
        auVar74._12_4_ = -auVar43._12_4_;
        uVar28 = -(uint)(-auVar43._0_4_ <= auVar43._0_4_);
        uVar29 = -(uint)(-auVar43._4_4_ <= auVar43._4_4_);
        uVar30 = -(uint)(auVar74._8_4_ <= auVar43._8_4_);
        uVar31 = -(uint)(auVar74._12_4_ <= auVar43._12_4_);
        fVar182 = (float)(local_258._0_4_ & uVar28 | ~uVar28 & (uint)-(float)local_258._0_4_);
        fVar167 = (float)(local_258._4_4_ & uVar29 | ~uVar29 & (uint)-(float)local_258._4_4_);
        fVar184 = (float)((uint)fStack_250 & uVar30 | ~uVar30 & (uint)-fStack_250);
        fVar169 = (float)((uint)fStack_24c & uVar31 | ~uVar31 & (uint)-fStack_24c);
        fVar158 = (float)(local_288._0_4_ & uVar28 | ~uVar28 & (uint)-(float)local_288._0_4_);
        fVar159 = (float)(local_288._4_4_ & uVar29 | ~uVar29 & (uint)-(float)local_288._4_4_);
        fVar180 = (float)((uint)fStack_280 & uVar30 | ~uVar30 & (uint)-fStack_280);
        fVar165 = (float)((uint)fStack_27c & uVar31 | ~uVar31 & (uint)-fStack_27c);
        fVar108 = (float)(local_268._0_4_ & uVar28 | ~uVar28 & (uint)-(float)local_268._0_4_);
        fVar109 = (float)(local_268._4_4_ & uVar29 | ~uVar29 & (uint)-(float)local_268._4_4_);
        fVar110 = (float)((uint)fStack_260 & uVar30 | ~uVar30 & (uint)-fStack_260);
        fVar112 = (float)((uint)fStack_25c & uVar31 | ~uVar31 & (uint)-fStack_25c);
        auVar114 = maxps(auVar74,auVar43);
        fVar33 = ABS(auVar43._0_4_);
        fVar32 = ABS(auVar43._4_4_);
        fVar44 = ABS(auVar43._8_4_);
        fVar77 = ABS(auVar43._12_4_);
        local_48 = (float)(~uVar28 & (uint)-(float)local_208._0_4_ | local_208._0_4_ & uVar28);
        fStack_44 = (float)(~uVar29 & (uint)-(float)local_208._4_4_ | local_208._4_4_ & uVar29);
        fStack_40 = (float)(~uVar30 & (uint)-fStack_200 | (uint)fStack_200 & uVar30);
        fStack_3c = (float)(~uVar31 & (uint)-fStack_1fc | (uint)fStack_1fc & uVar31);
        fVar183 = auVar114._0_4_;
        fVar223 = auVar114._4_4_;
        fVar203 = auVar114._8_4_;
        fVar75 = auVar114._12_4_;
        auVar118._0_4_ = 1.0 - fVar33;
        auVar118._4_4_ = 1.0 - fVar32;
        auVar118._8_4_ = 1.0 - fVar44;
        auVar118._12_4_ = 1.0 - fVar77;
        auVar114 = sqrtps(auVar118,auVar118);
        fVar47 = 1.5707964 -
                 auVar114._0_4_ *
                 (((((fVar33 * -0.0043095737 + 0.0192803) * fVar33 + -0.04489909) * fVar33 +
                   0.08785567) * fVar33 + -0.21450998) * fVar33 + 1.5707952);
        fVar154 = 1.5707964 -
                  auVar114._4_4_ *
                  (((((fVar32 * -0.0043095737 + 0.0192803) * fVar32 + -0.04489909) * fVar32 +
                    0.08785567) * fVar32 + -0.21450998) * fVar32 + 1.5707952);
        fVar76 = 1.5707964 -
                 auVar114._8_4_ *
                 (((((fVar44 * -0.0043095737 + 0.0192803) * fVar44 + -0.04489909) * fVar44 +
                   0.08785567) * fVar44 + -0.21450998) * fVar44 + 1.5707952);
        fVar78 = 1.5707964 -
                 auVar114._12_4_ *
                 (((((fVar77 * -0.0043095737 + 0.0192803) * fVar77 + -0.04489909) * fVar77 +
                   0.08785567) * fVar77 + -0.21450998) * fVar77 + 1.5707952);
        uVar28 = -(uint)(0.0 <= fVar47) & (uint)fVar47;
        uVar29 = -(uint)(0.0 <= fVar154) & (uint)fVar154;
        uVar30 = -(uint)(0.0 <= fVar76) & (uint)fVar76;
        uVar31 = -(uint)(0.0 <= fVar78) & (uint)fVar78;
        local_58 = (float)(~-(uint)(fVar33 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar183) & (uVar28 ^ 0x80000000) |
                                       uVar28 & -(uint)(0.0 <= fVar183))) & -(uint)(fVar33 <= 1.0))
                   * fVar111;
        fStack_54 = (float)(~-(uint)(fVar32 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar223) & (uVar29 ^ 0x80000000) |
                                        uVar29 & -(uint)(0.0 <= fVar223))) & -(uint)(fVar32 <= 1.0))
                    * fVar119;
        fStack_50 = (float)(~-(uint)(fVar44 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar203) & (uVar30 ^ 0x80000000) |
                                        uVar30 & -(uint)(0.0 <= fVar203))) & -(uint)(fVar44 <= 1.0))
                    * fVar121;
        fStack_4c = (float)(~-(uint)(fVar77 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar75) & (uVar31 ^ 0x80000000) |
                                        uVar31 & -(uint)(0.0 <= fVar75))) & -(uint)(fVar77 <= 1.0))
                    * fVar123;
        fVar33 = local_58 * 0.63661975;
        fVar32 = fStack_54 * 0.63661975;
        fVar44 = fStack_4c * 0.63661975;
        local_68 = floorf(fStack_50 * 0.63661975);
        local_78 = floorf(fVar44);
        local_88 = floorf(fVar33);
        fVar33 = floorf(fVar32);
        uVar28 = (uint)local_88;
        uVar30 = (uint)fVar33;
        uVar45 = (uint)local_68;
        uVar48 = (uint)local_78;
        fVar32 = local_58 - local_88 * 1.5707964;
        fVar33 = fStack_54 - fVar33 * 1.5707964;
        auVar178._4_4_ = fVar33;
        auVar178._0_4_ = fVar32;
        fVar44 = fStack_50 - local_68 * 1.5707964;
        fVar77 = fStack_4c - local_78 * 1.5707964;
        auVar178._8_4_ = fVar44;
        auVar178._12_4_ = fVar77;
        fVar47 = fVar32 * fVar32;
        fVar154 = fVar33 * fVar33;
        fVar76 = fVar44 * fVar44;
        fVar78 = fVar77 * fVar77;
        uVar145 = -(uint)(1 < (uVar28 & 3));
        uVar150 = -(uint)(1 < (uVar30 & 3));
        uVar152 = -(uint)(1 < (uVar45 & 3));
        uVar155 = -(uint)(1 < (uVar48 & 3));
        fVar32 = (((((fVar47 * -2.5029328e-08 + 2.7600126e-06) * fVar47 + -0.00019842605) * fVar47 +
                   0.008333348) * fVar47 + -0.16666667) * fVar47 + 1.0) * fVar32;
        fVar33 = (((((fVar154 * -2.5029328e-08 + 2.7600126e-06) * fVar154 + -0.00019842605) *
                    fVar154 + 0.008333348) * fVar154 + -0.16666667) * fVar154 + 1.0) * fVar33;
        fVar44 = (((((fVar76 * -2.5029328e-08 + 2.7600126e-06) * fVar76 + -0.00019842605) * fVar76 +
                   0.008333348) * fVar76 + -0.16666667) * fVar76 + 1.0) * fVar44;
        fVar77 = (((((fVar78 * -2.5029328e-08 + 2.7600126e-06) * fVar78 + -0.00019842605) * fVar78 +
                   0.008333348) * fVar78 + -0.16666667) * fVar78 + 1.0) * fVar77;
        uVar29 = -(uint)((uVar28 & 1) == 0);
        uVar31 = -(uint)((uVar30 & 1) == 0);
        uVar46 = -(uint)((uVar45 & 1) == 0);
        uVar49 = -(uint)((uVar48 & 1) == 0);
        fVar47 = ((((fVar47 * -2.5963018e-07 + 2.4756235e-05) * fVar47 + -0.001388833) * fVar47 +
                  0.04166664) * fVar47 + -0.5) * fVar47 + 1.0;
        fVar154 = ((((fVar154 * -2.5963018e-07 + 2.4756235e-05) * fVar154 + -0.001388833) * fVar154
                   + 0.04166664) * fVar154 + -0.5) * fVar154 + 1.0;
        fVar76 = ((((fVar76 * -2.5963018e-07 + 2.4756235e-05) * fVar76 + -0.001388833) * fVar76 +
                  0.04166664) * fVar76 + -0.5) * fVar76 + 1.0;
        fVar78 = ((((fVar78 * -2.5963018e-07 + 2.4756235e-05) * fVar78 + -0.001388833) * fVar78 +
                  0.04166664) * fVar78 + -0.5) * fVar78 + 1.0;
        uVar29 = ~uVar29 & (uint)fVar47 | (uint)fVar32 & uVar29;
        uVar31 = ~uVar31 & (uint)fVar154 | (uint)fVar33 & uVar31;
        uVar46 = ~uVar46 & (uint)fVar76 | (uint)fVar44 & uVar46;
        uVar49 = ~uVar49 & (uint)fVar78 | (uint)fVar77 & uVar49;
        uVar125 = (int)(uVar28 << 0x1f) >> 0x1f;
        uVar131 = (int)(uVar30 << 0x1f) >> 0x1f;
        uVar132 = (int)(uVar45 << 0x1f) >> 0x1f;
        uVar133 = (int)(uVar48 << 0x1f) >> 0x1f;
        uVar125 = ~uVar125 & (uint)fVar47 | (uint)fVar32 & uVar125;
        uVar131 = ~uVar131 & (uint)fVar154 | (uint)fVar33 & uVar131;
        uVar132 = ~uVar132 & (uint)fVar76 | (uint)fVar44 & uVar132;
        uVar133 = ~uVar133 & (uint)fVar78 | (uint)fVar77 & uVar133;
        fVar32 = (float)((uVar29 ^ 0x80000000) & uVar145 | ~uVar145 & uVar29);
        fVar77 = (float)((uVar31 ^ 0x80000000) & uVar150 | ~uVar150 & uVar31);
        fVar47 = (float)((uVar46 ^ 0x80000000) & uVar152 | ~uVar152 & uVar46);
        fVar154 = (float)((uVar49 ^ 0x80000000) & uVar155 | ~uVar155 & uVar49);
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar28 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar30 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar45 & 3) - 3 ^ 0x80000000));
        uVar31 = -(uint)(0x7ffffffd < (int)((uVar48 & 3) - 3 ^ 0x80000000));
        fVar120 = (float)((uVar125 ^ 0x80000000) & uVar28 | ~uVar28 & uVar125);
        fVar122 = (float)((uVar131 ^ 0x80000000) & uVar29 | ~uVar29 & uVar131);
        fVar124 = (float)((uVar132 ^ 0x80000000) & uVar30 | ~uVar30 & uVar132);
        fVar144 = (float)((uVar133 ^ 0x80000000) & uVar31 | ~uVar31 & uVar133);
        fVar33 = fVar149 * fVar183 - fVar182;
        fVar44 = fVar153 * fVar223 - fVar167;
        fVar76 = fVar179 * fVar203 - fVar184;
        fVar78 = fVar193 * fVar75 - fVar169;
        fVar200 = fVar238 * fVar183 - fVar158;
        fVar205 = fVar244 * fVar223 - fVar159;
        fVar207 = fVar249 * fVar203 - fVar180;
        fVar210 = fVar156 * fVar75 - fVar165;
        fVar214 = fVar212 * fVar183 - fVar108;
        fVar220 = fVar216 * fVar223 - fVar109;
        fVar225 = fVar222 * fVar203 - fVar110;
        fVar235 = fVar227 * fVar75 - fVar112;
        fVar151 = fVar198 * fVar183 - local_48;
        fVar170 = fVar202 * fVar223 - fStack_44;
        fVar181 = fVar206 * fVar203 - fStack_40;
        fVar196 = fVar208 * fVar75 - fStack_3c;
        auVar107._0_4_ = fVar151 * fVar151 + fVar214 * fVar214 + fVar200 * fVar200 + fVar33 * fVar33
        ;
        auVar107._4_4_ = fVar170 * fVar170 + fVar220 * fVar220 + fVar205 * fVar205 + fVar44 * fVar44
        ;
        auVar107._8_4_ = fVar181 * fVar181 + fVar225 * fVar225 + fVar207 * fVar207 + fVar76 * fVar76
        ;
        auVar107._12_4_ =
             fVar196 * fVar196 + fVar235 * fVar235 + fVar210 * fVar210 + fVar78 * fVar78;
        auVar114 = rsqrtps(auVar178,auVar107);
        fVar241 = auVar114._0_4_;
        fVar248 = auVar114._4_4_;
        fVar250 = auVar114._8_4_;
        fVar171 = auVar114._12_4_;
        fVar241 = fVar241 * 1.5 - fVar241 * fVar241 * auVar107._0_4_ * 0.5 * fVar241;
        fVar248 = fVar248 * 1.5 - fVar248 * fVar248 * auVar107._4_4_ * 0.5 * fVar248;
        fVar250 = fVar250 * 1.5 - fVar250 * fVar250 * auVar107._8_4_ * 0.5 * fVar250;
        fVar171 = fVar171 * 1.5 - fVar171 * fVar171 * auVar107._12_4_ * 0.5 * fVar171;
        fVar182 = (fVar182 - fVar149) * fVar111 + fVar149;
        fVar167 = (fVar167 - fVar153) * fVar119 + fVar153;
        fVar184 = (fVar184 - fVar179) * fVar121 + fVar179;
        fVar169 = (fVar169 - fVar193) * fVar123 + fVar193;
        fVar158 = (fVar158 - fVar238) * fVar111 + fVar238;
        fVar159 = (fVar159 - fVar244) * fVar119 + fVar244;
        fVar180 = (fVar180 - fVar249) * fVar121 + fVar249;
        fVar165 = (fVar165 - fVar156) * fVar123 + fVar156;
        fVar185 = (fVar108 - fVar212) * fVar111 + fVar212;
        fVar190 = (fVar109 - fVar216) * fVar119 + fVar216;
        fVar191 = (fVar110 - fVar222) * fVar121 + fVar222;
        fVar192 = (fVar112 - fVar227) * fVar123 + fVar227;
        fVar194 = (local_48 - fVar198) * fVar111 + fVar198;
        fVar197 = (fStack_44 - fVar202) * fVar119 + fVar202;
        fVar199 = (fStack_40 - fVar206) * fVar121 + fVar206;
        fVar201 = (fStack_3c - fVar208) * fVar123 + fVar208;
        auVar143._0_4_ = fVar185 * fVar185 + fVar158 * fVar158 + fVar182 * fVar182;
        auVar143._4_4_ = fVar190 * fVar190 + fVar159 * fVar159 + fVar167 * fVar167;
        auVar143._8_4_ = fVar191 * fVar191 + fVar180 * fVar180 + fVar184 * fVar184;
        auVar143._12_4_ = fVar192 * fVar192 + fVar165 * fVar165 + fVar169 * fVar169;
        auVar148._0_4_ = fVar194 * fVar194 + auVar143._0_4_;
        auVar148._4_4_ = fVar197 * fVar197 + auVar143._4_4_;
        auVar148._8_4_ = fVar199 * fVar199 + auVar143._8_4_;
        auVar148._12_4_ = fVar201 * fVar201 + auVar143._12_4_;
        auVar114 = rsqrtps(auVar143,auVar148);
        fVar108 = auVar114._0_4_;
        fVar109 = auVar114._4_4_;
        fVar110 = auVar114._8_4_;
        fVar112 = auVar114._12_4_;
        fVar108 = fVar108 * 1.5 - fVar108 * fVar108 * auVar148._0_4_ * 0.5 * fVar108;
        fVar109 = fVar109 * 1.5 - fVar109 * fVar109 * auVar148._4_4_ * 0.5 * fVar109;
        fVar110 = fVar110 * 1.5 - fVar110 * fVar110 * auVar148._8_4_ * 0.5 * fVar110;
        fVar112 = fVar112 * 1.5 - fVar112 * fVar112 * auVar148._12_4_ * 0.5 * fVar112;
        uVar28 = -(uint)(fVar183 <= 0.9995);
        uVar29 = -(uint)(fVar223 <= 0.9995);
        uVar30 = -(uint)(fVar203 <= 0.9995);
        uVar31 = -(uint)(fVar75 <= 0.9995);
        fVar203 = (float)(~uVar28 & (uint)(fVar182 * fVar108) |
                         (uint)(fVar149 * fVar120 - fVar33 * fVar241 * fVar32) & uVar28);
        fVar75 = (float)(~uVar29 & (uint)(fVar167 * fVar109) |
                        (uint)(fVar153 * fVar122 - fVar44 * fVar248 * fVar77) & uVar29);
        fVar76 = (float)(~uVar30 & (uint)(fVar184 * fVar110) |
                        (uint)(fVar179 * fVar124 - fVar76 * fVar250 * fVar47) & uVar30);
        fVar78 = (float)(~uVar31 & (uint)(fVar169 * fVar112) |
                        (uint)(fVar193 * fVar144 - fVar78 * fVar171 * fVar154) & uVar31);
        fVar33 = (float)(~uVar28 & (uint)(fVar158 * fVar108) |
                        (uint)(fVar238 * fVar120 - fVar200 * fVar241 * fVar32) & uVar28);
        fVar44 = (float)(~uVar29 & (uint)(fVar159 * fVar109) |
                        (uint)(fVar244 * fVar122 - fVar205 * fVar248 * fVar77) & uVar29);
        fVar183 = (float)(~uVar30 & (uint)(fVar180 * fVar110) |
                         (uint)(fVar249 * fVar124 - fVar207 * fVar250 * fVar47) & uVar30);
        fVar223 = (float)(~uVar31 & (uint)(fVar165 * fVar112) |
                         (uint)(fVar156 * fVar144 - fVar210 * fVar171 * fVar154) & uVar31);
        fVar149 = (float)(~uVar28 & (uint)(fVar185 * fVar108) |
                         (uint)(fVar212 * fVar120 - fVar214 * fVar241 * fVar32) & uVar28);
        fVar153 = (float)(~uVar29 & (uint)(fVar190 * fVar109) |
                         (uint)(fVar216 * fVar122 - fVar220 * fVar248 * fVar77) & uVar29);
        fVar179 = (float)(~uVar30 & (uint)(fVar191 * fVar110) |
                         (uint)(fVar222 * fVar124 - fVar225 * fVar250 * fVar47) & uVar30);
        fVar193 = (float)(~uVar31 & (uint)(fVar192 * fVar112) |
                         (uint)(fVar227 * fVar144 - fVar235 * fVar171 * fVar154) & uVar31);
        fVar32 = (float)(~uVar28 & (uint)(fVar108 * fVar194) |
                        (uint)(fVar120 * fVar198 - fVar241 * fVar151 * fVar32) & uVar28);
        fVar77 = (float)(~uVar29 & (uint)(fVar109 * fVar197) |
                        (uint)(fVar122 * fVar202 - fVar248 * fVar170 * fVar77) & uVar29);
        fVar47 = (float)(~uVar30 & (uint)(fVar110 * fVar199) |
                        (uint)(fVar124 * fVar206 - fVar250 * fVar181 * fVar47) & uVar30);
        fVar154 = (float)(~uVar31 & (uint)(fVar112 * fVar201) |
                         (uint)(fVar144 * fVar208 - fVar171 * fVar196 * fVar154) & uVar31);
        fVar120 = 1.0 - fVar111;
        fVar122 = 1.0 - fVar119;
        fVar124 = 1.0 - fVar121;
        fVar144 = 1.0 - fVar123;
        fVar151 = (float)local_248._0_4_ * fVar120 + (float)local_f8._0_4_ * fVar111;
        fVar170 = (float)local_248._4_4_ * fVar122 + (float)local_f8._4_4_ * fVar119;
        fVar181 = fStack_240 * fVar124 + fStack_f0 * fVar121;
        fVar196 = fStack_23c * fVar144 + fStack_ec * fVar123;
        fVar198 = (float)local_218._0_4_ * fVar120 + (float)local_e8._0_4_ * fVar111;
        fVar200 = (float)local_218._4_4_ * fVar122 + (float)local_e8._4_4_ * fVar119;
        fVar202 = fStack_210 * fVar124 + fStack_e0 * fVar121;
        fVar205 = fStack_20c * fVar144 + fStack_dc * fVar123;
        fVar108 = (float)local_298._0_4_ * fVar120 + (float)local_d8._0_4_ * fVar111;
        fVar109 = (float)local_298._4_4_ * fVar122 + (float)local_d8._4_4_ * fVar119;
        fVar110 = (float)uStack_290 * fVar124 + fStack_d0 * fVar121;
        fVar112 = uStack_290._4_4_ * fVar144 + fStack_cc * fVar123;
        local_238._4_4_ = (float)local_238._4_4_ * fVar122 + (float)local_1a8._4_4_ * fVar119;
        local_238._0_4_ = (float)local_238._0_4_ * fVar120 + (float)local_1a8._0_4_ * fVar111;
        uStack_230._0_4_ = (float)uStack_230 * fVar124 + fStack_1a0 * fVar121;
        uStack_230._4_4_ = uStack_230._4_4_ * fVar144 + fStack_19c * fVar123;
        local_278._4_4_ = (float)local_278._4_4_ * fVar122 + (float)local_198._4_4_ * fVar119;
        local_278._0_4_ = (float)local_278._0_4_ * fVar120 + (float)local_198._0_4_ * fVar111;
        fStack_270 = fStack_270 * fVar124 + fStack_190 * fVar121;
        fStack_26c = fStack_26c * fVar144 + fStack_18c * fVar123;
        local_2d8._4_4_ = (float)local_2d8._4_4_ * fVar122 + (float)local_188._4_4_ * fVar119;
        local_2d8._0_4_ = (float)local_2d8._0_4_ * fVar120 + (float)local_188._0_4_ * fVar111;
        uStack_2d0._0_4_ = (float)uStack_2d0 * fVar124 + fStack_180 * fVar121;
        uStack_2d0._4_4_ = uStack_2d0._4_4_ * fVar144 + fStack_17c * fVar123;
        local_1c8._4_4_ = (float)local_1c8._4_4_ * fVar122 + (float)local_178._4_4_ * fVar119;
        local_1c8._0_4_ = (float)local_1c8._0_4_ * fVar120 + (float)local_178._0_4_ * fVar111;
        fStack_1c0 = fStack_1c0 * fVar124 + fStack_170 * fVar121;
        fStack_1bc = fStack_1bc * fVar144 + fStack_16c * fVar123;
        local_1d8._4_4_ = (float)local_1d8._4_4_ * fVar122 + (float)local_168._4_4_ * fVar119;
        local_1d8._0_4_ = (float)local_1d8._0_4_ * fVar120 + (float)local_168._0_4_ * fVar111;
        fStack_1d0 = fStack_1d0 * fVar124 + fStack_160 * fVar121;
        fStack_1cc = fStack_1cc * fVar144 + fStack_15c * fVar123;
        local_228._4_4_ = (float)local_228._4_4_ * fVar122 + (float)local_158._4_4_ * fVar119;
        local_228._0_4_ = (float)local_228._0_4_ * fVar120 + (float)local_158._0_4_ * fVar111;
        fStack_220 = fStack_220 * fVar124 + fStack_150 * fVar121;
        fStack_21c = fStack_21c * fVar144 + fStack_14c * fVar123;
        local_2b8._4_4_ = (float)local_2b8._4_4_ * fVar122 + (float)local_148._4_4_ * fVar119;
        local_2b8._0_4_ = (float)local_2b8._0_4_ * fVar120 + (float)local_148._0_4_ * fVar111;
        uStack_2b0._0_4_ = (float)uStack_2b0 * fVar124 + fStack_140 * fVar121;
        uStack_2b0._4_4_ = uStack_2b0._4_4_ * fVar144 + fStack_13c * fVar123;
        local_2a8._4_4_ = (float)local_2a8._4_4_ * fVar122 + (float)local_1f8._4_4_ * fVar119;
        local_2a8._0_4_ = (float)local_2a8._0_4_ * fVar120 + (float)local_1f8._0_4_ * fVar111;
        uStack_2a0._0_4_ = (float)uStack_2a0 * fVar124 + fStack_1f0 * fVar121;
        uStack_2a0._4_4_ = uStack_2a0._4_4_ * fVar144 + fStack_1ec * fVar123;
        fVar120 = fVar120 * (float)local_b8._0_4_;
        fVar122 = fVar122 * (float)local_b8._4_4_;
        fVar124 = fVar124 * fStack_b0;
        fVar144 = fVar144 * fStack_ac;
      }
      fVar120 = fVar120 + (float)local_1e8._0_4_ * fVar111;
      fVar122 = fVar122 + (float)local_1e8._4_4_ * fVar119;
      fVar124 = fVar124 + fStack_1e0 * fVar121;
      fVar144 = fVar144 + fStack_1dc * fVar123;
      fVar206 = fVar33 * fVar149 + fVar203 * fVar32;
      fVar207 = fVar44 * fVar153 + fVar75 * fVar77;
      fVar208 = fVar183 * fVar179 + fVar76 * fVar47;
      fVar210 = fVar223 * fVar193 + fVar78 * fVar154;
      fVar212 = fVar33 * fVar149 - fVar203 * fVar32;
      fVar214 = fVar44 * fVar153 - fVar75 * fVar77;
      fVar216 = fVar183 * fVar179 - fVar76 * fVar47;
      fVar220 = fVar223 * fVar193 - fVar78 * fVar154;
      fVar238 = fVar149 * fVar149;
      fVar241 = fVar153 * fVar153;
      fVar244 = fVar179 * fVar179;
      fVar248 = fVar193 * fVar193;
      fVar111 = fVar203 * fVar203 - fVar33 * fVar33;
      fVar119 = fVar75 * fVar75 - fVar44 * fVar44;
      fVar121 = fVar76 * fVar76 - fVar183 * fVar183;
      fVar123 = fVar78 * fVar78 - fVar223 * fVar223;
      fVar222 = fVar33 * fVar32 - fVar203 * fVar149;
      fVar225 = fVar44 * fVar77 - fVar75 * fVar153;
      fVar227 = fVar183 * fVar47 - fVar76 * fVar179;
      fVar235 = fVar223 * fVar154 - fVar78 * fVar193;
      fVar228 = fVar203 * fVar149 + fVar33 * fVar32;
      fVar236 = fVar75 * fVar153 + fVar44 * fVar77;
      fVar239 = fVar76 * fVar179 + fVar183 * fVar47;
      fVar242 = fVar78 * fVar193 + fVar223 * fVar154;
      fVar249 = fVar32 * fVar149 + fVar33 * fVar203;
      fVar250 = fVar77 * fVar153 + fVar44 * fVar75;
      fVar156 = fVar47 * fVar179 + fVar183 * fVar76;
      fVar171 = fVar154 * fVar193 + fVar223 * fVar78;
      fVar149 = fVar32 * fVar149 - fVar33 * fVar203;
      fVar153 = fVar77 * fVar153 - fVar44 * fVar75;
      fVar179 = fVar47 * fVar179 - fVar183 * fVar76;
      fVar193 = fVar154 * fVar193 - fVar223 * fVar78;
      fVar32 = fVar32 * fVar32;
      fVar77 = fVar77 * fVar77;
      fVar47 = fVar47 * fVar47;
      fVar154 = fVar154 * fVar154;
      fVar209 = ((fVar203 * fVar203 + fVar33 * fVar33) - fVar238) - fVar32;
      fVar211 = ((fVar75 * fVar75 + fVar44 * fVar44) - fVar241) - fVar77;
      fVar213 = ((fVar76 * fVar76 + fVar183 * fVar183) - fVar244) - fVar47;
      fVar215 = ((fVar78 * fVar78 + fVar223 * fVar223) - fVar248) - fVar154;
      fVar203 = (fVar238 + fVar111) - fVar32;
      fVar75 = (fVar241 + fVar119) - fVar77;
      fVar76 = (fVar244 + fVar121) - fVar47;
      fVar78 = (fVar248 + fVar123) - fVar154;
      fVar32 = (fVar111 - fVar238) + fVar32;
      fVar77 = (fVar119 - fVar241) + fVar77;
      fVar47 = (fVar121 - fVar244) + fVar47;
      fVar154 = (fVar123 - fVar248) + fVar154;
      fVar206 = fVar206 + fVar206;
      fVar207 = fVar207 + fVar207;
      fVar208 = fVar208 + fVar208;
      fVar210 = fVar210 + fVar210;
      fVar222 = fVar222 + fVar222;
      fVar225 = fVar225 + fVar225;
      fVar227 = fVar227 + fVar227;
      fVar235 = fVar235 + fVar235;
      fVar238 = fVar222 * 0.0;
      fVar241 = fVar225 * 0.0;
      fVar244 = fVar227 * 0.0;
      fVar248 = fVar235 * 0.0;
      fVar33 = fVar206 * 0.0;
      fVar119 = fVar207 * 0.0;
      fVar123 = fVar208 * 0.0;
      fVar183 = fVar210 * 0.0;
      fVar111 = fVar33 + fVar238 + fVar209;
      fVar121 = fVar119 + fVar241 + fVar211;
      fVar44 = fVar123 + fVar244 + fVar213;
      fVar223 = fVar183 + fVar248 + fVar215;
      fVar209 = fVar209 * 0.0;
      fVar211 = fVar211 * 0.0;
      fVar213 = fVar213 * 0.0;
      fVar215 = fVar215 * 0.0;
      fVar158 = fVar238 + fVar206 + fVar209;
      fVar180 = fVar241 + fVar207 + fVar211;
      fVar182 = fVar244 + fVar208 + fVar213;
      fVar184 = fVar248 + fVar210 + fVar215;
      fVar209 = fVar209 + fVar222 + fVar33;
      fVar211 = fVar211 + fVar225 + fVar119;
      fVar213 = fVar213 + fVar227 + fVar123;
      fVar215 = fVar215 + fVar235 + fVar183;
      fVar249 = fVar249 + fVar249;
      fVar250 = fVar250 + fVar250;
      fVar156 = fVar156 + fVar156;
      fVar171 = fVar171 + fVar171;
      fVar206 = fVar249 * 0.0;
      fVar207 = fVar250 * 0.0;
      fVar222 = fVar156 * 0.0;
      fVar225 = fVar171 * 0.0;
      fVar33 = fVar203 * 0.0;
      fVar119 = fVar75 * 0.0;
      fVar123 = fVar76 * 0.0;
      fVar183 = fVar78 * 0.0;
      fVar212 = fVar212 + fVar212;
      fVar214 = fVar214 + fVar214;
      fVar216 = fVar216 + fVar216;
      fVar220 = fVar220 + fVar220;
      fVar238 = fVar206 + fVar33 + fVar212;
      fVar241 = fVar207 + fVar119 + fVar214;
      fVar244 = fVar222 + fVar123 + fVar216;
      fVar248 = fVar225 + fVar183 + fVar220;
      fVar212 = fVar212 * 0.0;
      fVar214 = fVar214 * 0.0;
      fVar216 = fVar216 * 0.0;
      fVar220 = fVar220 * 0.0;
      fVar208 = fVar203 + fVar206 + fVar212;
      fVar210 = fVar75 + fVar207 + fVar214;
      fVar222 = fVar76 + fVar222 + fVar216;
      fVar225 = fVar78 + fVar225 + fVar220;
      fVar212 = fVar212 + fVar33 + fVar249;
      fVar214 = fVar214 + fVar119 + fVar250;
      fVar216 = fVar216 + fVar123 + fVar156;
      fVar220 = fVar220 + fVar183 + fVar171;
      fVar149 = fVar149 + fVar149;
      fVar153 = fVar153 + fVar153;
      fVar179 = fVar179 + fVar179;
      fVar193 = fVar193 + fVar193;
      fVar203 = fVar32 * 0.0;
      fVar75 = fVar77 * 0.0;
      fVar76 = fVar47 * 0.0;
      fVar78 = fVar154 * 0.0;
      fVar33 = fVar149 * 0.0;
      fVar119 = fVar153 * 0.0;
      fVar123 = fVar179 * 0.0;
      fVar183 = fVar193 * 0.0;
      fVar228 = fVar228 + fVar228;
      fVar236 = fVar236 + fVar236;
      fVar239 = fVar239 + fVar239;
      fVar242 = fVar242 + fVar242;
      fVar159 = fVar33 + fVar203 + fVar228;
      fVar165 = fVar119 + fVar75 + fVar236;
      fVar167 = fVar123 + fVar76 + fVar239;
      fVar169 = fVar183 + fVar78 + fVar242;
      fVar228 = fVar228 * 0.0;
      fVar236 = fVar236 * 0.0;
      fVar239 = fVar239 * 0.0;
      fVar242 = fVar242 * 0.0;
      fVar249 = fVar203 + fVar149 + fVar228;
      fVar250 = fVar75 + fVar153 + fVar236;
      fVar156 = fVar76 + fVar179 + fVar239;
      fVar171 = fVar78 + fVar193 + fVar242;
      fVar228 = fVar228 + fVar33 + fVar32;
      fVar236 = fVar236 + fVar119 + fVar77;
      fVar239 = fVar239 + fVar123 + fVar47;
      fVar242 = fVar242 + fVar183 + fVar154;
      fVar185 = fVar151 * fVar111 + fVar238 * 0.0 + fVar159 * 0.0;
      fVar190 = fVar170 * fVar121 + fVar241 * 0.0 + fVar165 * 0.0;
      fVar191 = fVar181 * fVar44 + fVar244 * 0.0 + fVar167 * 0.0;
      fVar192 = fVar196 * fVar223 + fVar248 * 0.0 + fVar169 * 0.0;
      fVar179 = fVar151 * fVar158 + fVar208 * 0.0 + fVar249 * 0.0;
      fVar193 = fVar170 * fVar180 + fVar210 * 0.0 + fVar250 * 0.0;
      fVar206 = fVar181 * fVar182 + fVar222 * 0.0 + fVar156 * 0.0;
      fVar207 = fVar196 * fVar184 + fVar225 * 0.0 + fVar171 * 0.0;
      fVar227 = fVar151 * fVar209 + fVar212 * 0.0 + fVar228 * 0.0;
      fVar235 = fVar170 * fVar211 + fVar214 * 0.0 + fVar236 * 0.0;
      fVar181 = fVar181 * fVar213 + fVar216 * 0.0 + fVar239 * 0.0;
      fVar196 = fVar196 * fVar215 + fVar220 * 0.0 + fVar242 * 0.0;
      fVar123 = (float)local_238._0_4_ * fVar111 + (float)local_278._0_4_ * fVar238 + fVar159 * 0.0;
      fVar77 = (float)local_238._4_4_ * fVar121 + (float)local_278._4_4_ * fVar241 + fVar165 * 0.0;
      fVar183 = (float)uStack_230 * fVar44 + fStack_270 * fVar244 + fVar167 * 0.0;
      fVar154 = uStack_230._4_4_ * fVar223 + fStack_26c * fVar248 + fVar169 * 0.0;
      fVar203 = (float)local_238._0_4_ * fVar158 + (float)local_278._0_4_ * fVar208 + fVar249 * 0.0;
      fVar76 = (float)local_238._4_4_ * fVar180 + (float)local_278._4_4_ * fVar210 + fVar250 * 0.0;
      fVar149 = (float)uStack_230 * fVar182 + fStack_270 * fVar222 + fVar156 * 0.0;
      fVar153 = uStack_230._4_4_ * fVar184 + fStack_26c * fVar225 + fVar171 * 0.0;
      fVar217 = (float)local_238._0_4_ * fVar209 + (float)local_278._0_4_ * fVar212 + fVar228 * 0.0;
      fVar221 = (float)local_238._4_4_ * fVar211 + (float)local_278._4_4_ * fVar214 + fVar236 * 0.0;
      fVar224 = (float)uStack_230 * fVar213 + fStack_270 * fVar216 + fVar239 * 0.0;
      fVar226 = uStack_230._4_4_ * fVar215 + fStack_26c * fVar220 + fVar242 * 0.0;
      fVar75 = (float)local_1c8._0_4_ * fVar111 +
               (float)local_1d8._0_4_ * fVar238 + (float)local_228._0_4_ * fVar159;
      fVar78 = (float)local_1c8._4_4_ * fVar121 +
               (float)local_1d8._4_4_ * fVar241 + (float)local_228._4_4_ * fVar165;
      fVar151 = fStack_1c0 * fVar44 + fStack_1d0 * fVar244 + fStack_220 * fVar167;
      fVar170 = fStack_1bc * fVar223 + fStack_1cc * fVar248 + fStack_21c * fVar169;
      fVar229 = (float)local_1c8._0_4_ * fVar158 +
                (float)local_1d8._0_4_ * fVar208 + (float)local_228._0_4_ * fVar249;
      fVar237 = (float)local_1c8._4_4_ * fVar180 +
                (float)local_1d8._4_4_ * fVar210 + (float)local_228._4_4_ * fVar250;
      fVar240 = fStack_1c0 * fVar182 + fStack_1d0 * fVar222 + fStack_220 * fVar156;
      fVar243 = fStack_1bc * fVar184 + fStack_1cc * fVar225 + fStack_21c * fVar171;
      fVar194 = (float)local_1c8._0_4_ * fVar209 +
                (float)local_1d8._0_4_ * fVar212 + (float)local_228._0_4_ * fVar228;
      fVar197 = (float)local_1c8._4_4_ * fVar211 +
                (float)local_1d8._4_4_ * fVar214 + (float)local_228._4_4_ * fVar236;
      fVar199 = fStack_1c0 * fVar213 + fStack_1d0 * fVar216 + fStack_220 * fVar239;
      fVar201 = fStack_1bc * fVar215 + fStack_1cc * fVar220 + fStack_21c * fVar242;
      fVar198 = fVar111 * (float)local_2b8._0_4_ +
                fVar238 * (float)local_2a8._0_4_ + fVar159 * fVar120 + fVar198 + 0.0;
      fVar200 = fVar121 * (float)local_2b8._4_4_ +
                fVar241 * (float)local_2a8._4_4_ + fVar165 * fVar122 + fVar200 + 0.0;
      fVar202 = fVar44 * (float)uStack_2b0 + fVar244 * (float)uStack_2a0 + fVar167 * fVar124 +
                fVar202 + 0.0;
      fVar205 = fVar223 * uStack_2b0._4_4_ + fVar248 * uStack_2a0._4_4_ + fVar169 * fVar144 +
                fVar205 + 0.0;
      fVar33 = fVar158 * (float)local_2b8._0_4_ +
               fVar208 * (float)local_2a8._0_4_ + fVar249 * fVar120 + fVar108 + 0.0;
      fVar32 = fVar180 * (float)local_2b8._4_4_ +
               fVar210 * (float)local_2a8._4_4_ + fVar250 * fVar122 + fVar109 + 0.0;
      fVar111 = fVar182 * (float)uStack_2b0 + fVar222 * (float)uStack_2a0 + fVar156 * fVar124 +
                fVar110 + 0.0;
      fVar119 = fVar184 * uStack_2b0._4_4_ + fVar225 * uStack_2a0._4_4_ + fVar171 * fVar144 +
                fVar112 + 0.0;
      fVar121 = fVar209 * (float)local_2b8._0_4_ +
                fVar212 * (float)local_2a8._0_4_ + fVar228 * fVar120 + (float)local_2d8._0_4_ + 0.0;
      fVar44 = fVar211 * (float)local_2b8._4_4_ +
               fVar214 * (float)local_2a8._4_4_ + fVar236 * fVar122 + (float)local_2d8._4_4_ + 0.0;
      fVar47 = fVar213 * (float)uStack_2b0 + fVar216 * (float)uStack_2a0 + fVar239 * fVar124 +
               (float)uStack_2d0 + 0.0;
      fVar223 = fVar215 * uStack_2b0._4_4_ + fVar220 * uStack_2a0._4_4_ + fVar242 * fVar144 +
                uStack_2d0._4_4_ + 0.0;
      auVar162._0_4_ = fVar203 * fVar194 - fVar217 * fVar229;
      auVar162._4_4_ = fVar76 * fVar197 - fVar221 * fVar237;
      auVar162._8_4_ = fVar149 * fVar199 - fVar224 * fVar240;
      auVar162._12_4_ = fVar153 * fVar201 - fVar226 * fVar243;
      auVar128._0_4_ = fVar217 * fVar75 - fVar123 * fVar194;
      auVar128._4_4_ = fVar221 * fVar78 - fVar77 * fVar197;
      auVar128._8_4_ = fVar224 * fVar151 - fVar183 * fVar199;
      auVar128._12_4_ = fVar226 * fVar170 - fVar154 * fVar201;
      auVar38._0_4_ = fVar123 * fVar229 - fVar203 * fVar75;
      auVar38._4_4_ = fVar77 * fVar237 - fVar76 * fVar78;
      auVar38._8_4_ = fVar183 * fVar240 - fVar149 * fVar151;
      auVar38._12_4_ = fVar154 * fVar243 - fVar153 * fVar170;
      auVar138._0_4_ = fVar229 * fVar227 - fVar194 * fVar179;
      auVar138._4_4_ = fVar237 * fVar235 - fVar197 * fVar193;
      auVar138._8_4_ = fVar240 * fVar181 - fVar199 * fVar206;
      auVar138._12_4_ = fVar243 * fVar196 - fVar201 * fVar207;
      auVar195._0_4_ = fVar194 * fVar185 - fVar75 * fVar227;
      auVar195._4_4_ = fVar197 * fVar190 - fVar78 * fVar235;
      auVar195._8_4_ = fVar199 * fVar191 - fVar151 * fVar181;
      auVar195._12_4_ = fVar201 * fVar192 - fVar170 * fVar196;
      auVar81._0_4_ = fVar75 * fVar179 - fVar229 * fVar185;
      auVar81._4_4_ = fVar78 * fVar193 - fVar237 * fVar190;
      auVar81._8_4_ = fVar151 * fVar206 - fVar240 * fVar191;
      auVar81._12_4_ = fVar170 * fVar207 - fVar243 * fVar192;
      auVar56._0_4_ = fVar179 * fVar217 - fVar227 * fVar203;
      auVar56._4_4_ = fVar193 * fVar221 - fVar235 * fVar76;
      auVar56._8_4_ = fVar206 * fVar224 - fVar181 * fVar149;
      auVar56._12_4_ = fVar207 * fVar226 - fVar196 * fVar153;
      auVar188._0_4_ = fVar227 * fVar123 - fVar217 * fVar185;
      auVar188._4_4_ = fVar235 * fVar77 - fVar221 * fVar190;
      auVar188._8_4_ = fVar181 * fVar183 - fVar224 * fVar191;
      auVar188._12_4_ = fVar196 * fVar154 - fVar226 * fVar192;
      auVar176._0_4_ = fVar203 * fVar185 - fVar123 * fVar179;
      auVar176._4_4_ = fVar76 * fVar190 - fVar77 * fVar193;
      auVar176._8_4_ = fVar149 * fVar191 - fVar183 * fVar206;
      auVar176._12_4_ = fVar153 * fVar192 - fVar154 * fVar207;
      auVar204._0_4_ = fVar185 * auVar162._0_4_ + fVar179 * auVar128._0_4_ + fVar227 * auVar38._0_4_
      ;
      auVar204._4_4_ = fVar190 * auVar162._4_4_ + fVar193 * auVar128._4_4_ + fVar235 * auVar38._4_4_
      ;
      auVar204._8_4_ = fVar191 * auVar162._8_4_ + fVar206 * auVar128._8_4_ + fVar181 * auVar38._8_4_
      ;
      auVar204._12_4_ =
           fVar192 * auVar162._12_4_ + fVar207 * auVar128._12_4_ + fVar196 * auVar38._12_4_;
      auVar161 = divps(auVar162,auVar204);
      auVar135 = divps(auVar138,auVar204);
      auVar54 = divps(auVar56,auVar204);
      auVar127 = divps(auVar128,auVar204);
      auVar231 = divps(auVar195,auVar204);
      auVar187 = divps(auVar188,auVar204);
      auVar114 = divps(auVar38,auVar204);
      auVar36 = divps(auVar81,auVar204);
      auVar173 = divps(auVar176,auVar204);
      fVar123 = fVar198 * auVar161._0_4_ + fVar33 * auVar127._0_4_ + fVar121 * auVar114._0_4_;
      fVar77 = fVar200 * auVar161._4_4_ + fVar32 * auVar127._4_4_ + fVar44 * auVar114._4_4_;
      fVar183 = fVar202 * auVar161._8_4_ + fVar111 * auVar127._8_4_ + fVar47 * auVar114._8_4_;
      fVar154 = fVar205 * auVar161._12_4_ + fVar119 * auVar127._12_4_ + fVar223 * auVar114._12_4_;
      fVar203 = fVar198 * auVar135._0_4_ + fVar33 * auVar231._0_4_ + fVar121 * auVar36._0_4_;
      fVar75 = fVar200 * auVar135._4_4_ + fVar32 * auVar231._4_4_ + fVar44 * auVar36._4_4_;
      fVar76 = fVar202 * auVar135._8_4_ + fVar111 * auVar231._8_4_ + fVar47 * auVar36._8_4_;
      fVar78 = fVar205 * auVar135._12_4_ + fVar119 * auVar231._12_4_ + fVar223 * auVar36._12_4_;
      fVar33 = fVar198 * auVar54._0_4_ + fVar33 * auVar187._0_4_ + fVar121 * auVar173._0_4_;
      fVar32 = fVar200 * auVar54._4_4_ + fVar32 * auVar187._4_4_ + fVar44 * auVar173._4_4_;
      fVar111 = fVar202 * auVar54._8_4_ + fVar111 * auVar187._8_4_ + fVar47 * auVar173._8_4_;
      fVar119 = fVar205 * auVar54._12_4_ + fVar119 * auVar187._12_4_ + fVar223 * auVar173._12_4_;
    }
    else {
      BVar8 = (pIVar9->super_Geometry).time_range;
      fVar32 = BVar8.lower;
      auVar51._0_4_ = BVar8.upper - fVar32;
      fVar33 = (pIVar9->super_Geometry).fnumTimeSegments;
      auVar218._4_4_ = fVar33;
      auVar218._0_4_ = fVar33;
      auVar218._8_4_ = fVar33;
      auVar218._12_4_ = fVar33;
      auVar113._0_4_ = *(float *)(ray + 0x70) - fVar32;
      auVar113._4_4_ = *(float *)(ray + 0x74) - fVar32;
      auVar113._8_4_ = *(float *)(ray + 0x78) - fVar32;
      auVar113._12_4_ = *(float *)(ray + 0x7c) - fVar32;
      auVar51._4_4_ = auVar51._0_4_;
      auVar51._8_4_ = auVar51._0_4_;
      auVar51._12_4_ = auVar51._0_4_;
      auVar114 = divps(auVar113,auVar51);
      fVar111 = auVar114._0_4_ * fVar33;
      fVar119 = auVar114._4_4_ * fVar33;
      fVar121 = auVar114._8_4_ * fVar33;
      fVar123 = auVar114._12_4_ * fVar33;
      pRVar27 = context;
      local_2b8._0_4_ = floorf(fVar121);
      uVar25 = SUB84(pRVar27,0);
      local_2b8._4_4_ = extraout_XMM0_Db;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd;
      local_2a8._0_4_ = floorf(fVar123);
      local_2a8._4_4_ = extraout_XMM0_Db_00;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_00;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_00;
      local_298._0_4_ = floorf(fVar111);
      local_298._4_4_ = extraout_XMM0_Db_01;
      uStack_290._0_4_ = (float)extraout_XMM0_Dc_01;
      uStack_290._4_4_ = (float)extraout_XMM0_Dd_01;
      fVar32 = floorf(fVar119);
      auVar52._4_4_ = fVar32;
      auVar52._0_4_ = local_298._0_4_;
      auVar52._8_4_ = local_2b8._0_4_;
      auVar52._12_4_ = local_2a8._0_4_;
      auVar34._0_4_ = fVar33 + -1.0;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar114 = minps(auVar52,auVar34);
      auVar114 = maxps(auVar114,ZEXT816(0));
      auVar245._0_4_ = fVar111 - auVar114._0_4_;
      auVar245._4_4_ = fVar119 - auVar114._4_4_;
      auVar245._8_4_ = fVar121 - auVar114._8_4_;
      auVar245._12_4_ = fVar123 - auVar114._12_4_;
      iVar157 = (int)auVar114._0_4_;
      iVar164 = (int)auVar114._4_4_;
      iVar166 = (int)auVar114._8_4_;
      iVar168 = (int)auVar114._12_4_;
      local_a8 = CONCAT44(iVar164,iVar157);
      uStack_a0 = (RTCRayQueryContext *)CONCAT44(iVar168,iVar166);
      lVar23 = 0;
      if ((uVar28 & 0xff) != 0) {
        for (; ((uVar28 & 0xff) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      iVar26 = *(int *)((long)&local_a8 + lVar23 * 4);
      lVar23 = (long)iVar26;
      auVar35._0_4_ = -(uint)(iVar26 == iVar157);
      auVar35._4_4_ = -(uint)(iVar26 == iVar164);
      auVar35._8_4_ = -(uint)(iVar26 == iVar166);
      auVar35._12_4_ = -(uint)(iVar26 == iVar168);
      auVar36 = ~auVar35 & auVar50;
      iVar26 = movmskps(uVar25,auVar36);
      auVar114 = auVar50;
      auVar54 = auVar245;
      if (iVar26 == 0) {
        pAVar11 = pIVar9->local2world;
        pAVar2 = pAVar11 + lVar23;
        fVar33 = (pAVar2->l).vx.field_0.m128[0];
        fVar32 = (pAVar2->l).vx.field_0.m128[1];
        fVar111 = (pAVar2->l).vx.field_0.m128[2];
        pVVar3 = &pAVar11[lVar23].l.vy;
        fVar119 = (pVVar3->field_0).m128[0];
        fVar121 = (pVVar3->field_0).m128[1];
        fVar123 = (pVVar3->field_0).m128[2];
        pVVar3 = &pAVar11[lVar23].l.vz;
        fVar44 = (pVVar3->field_0).m128[0];
        fVar77 = (pVVar3->field_0).m128[1];
        fVar183 = (pVVar3->field_0).m128[2];
        pVVar3 = &pAVar11[lVar23].p;
        fVar47 = (pVVar3->field_0).m128[0];
        fVar223 = (pVVar3->field_0).m128[1];
        fVar154 = (pVVar3->field_0).m128[2];
        pAVar2 = pAVar11 + lVar23 + 1;
        fVar203 = (pAVar2->l).vx.field_0.m128[0];
        fVar75 = (pAVar2->l).vx.field_0.m128[1];
        fVar76 = (pAVar2->l).vx.field_0.m128[2];
        pVVar3 = &pAVar11[lVar23 + 1].l.vy;
        fVar78 = (pVVar3->field_0).m128[0];
        fVar108 = (pVVar3->field_0).m128[1];
        fVar109 = (pVVar3->field_0).m128[2];
        fVar216 = 1.0 - auVar245._0_4_;
        fVar220 = 1.0 - auVar245._4_4_;
        fVar222 = 1.0 - auVar245._8_4_;
        fVar225 = 1.0 - auVar245._12_4_;
        fVar144 = fVar33 * fVar216 + fVar203 * auVar245._0_4_;
        fVar149 = fVar33 * fVar220 + fVar203 * auVar245._4_4_;
        fVar151 = fVar33 * fVar222 + fVar203 * auVar245._8_4_;
        fVar153 = fVar33 * fVar225 + fVar203 * auVar245._12_4_;
        fVar202 = fVar32 * fVar216 + fVar75 * auVar245._0_4_;
        fVar205 = fVar32 * fVar220 + fVar75 * auVar245._4_4_;
        fVar206 = fVar32 * fVar222 + fVar75 * auVar245._8_4_;
        fVar207 = fVar32 * fVar225 + fVar75 * auVar245._12_4_;
        pVVar3 = &pAVar11[lVar23 + 1].l.vz;
        fVar33 = (pVVar3->field_0).m128[0];
        fVar32 = (pVVar3->field_0).m128[1];
        fVar203 = (pVVar3->field_0).m128[2];
        fVar193 = fVar111 * fVar216 + fVar76 * auVar245._0_4_;
        fVar196 = fVar111 * fVar220 + fVar76 * auVar245._4_4_;
        fVar198 = fVar111 * fVar222 + fVar76 * auVar245._8_4_;
        fVar200 = fVar111 * fVar225 + fVar76 * auVar245._12_4_;
        fVar112 = fVar119 * fVar216 + fVar78 * auVar245._0_4_;
        fVar120 = fVar119 * fVar220 + fVar78 * auVar245._4_4_;
        fVar122 = fVar119 * fVar222 + fVar78 * auVar245._8_4_;
        fVar124 = fVar119 * fVar225 + fVar78 * auVar245._12_4_;
        fVar208 = fVar121 * fVar216 + fVar108 * auVar245._0_4_;
        fVar210 = fVar121 * fVar220 + fVar108 * auVar245._4_4_;
        fVar212 = fVar121 * fVar222 + fVar108 * auVar245._8_4_;
        fVar214 = fVar121 * fVar225 + fVar108 * auVar245._12_4_;
        pVVar3 = &pAVar11[lVar23 + 1].p;
        fVar111 = (pVVar3->field_0).m128[0];
        fVar119 = (pVVar3->field_0).m128[1];
        fVar121 = (pVVar3->field_0).m128[2];
        fVar227 = fVar123 * fVar216 + fVar109 * auVar245._0_4_;
        fVar235 = fVar123 * fVar220 + fVar109 * auVar245._4_4_;
        fVar238 = fVar123 * fVar222 + fVar109 * auVar245._8_4_;
        fVar241 = fVar123 * fVar225 + fVar109 * auVar245._12_4_;
        fVar78 = fVar44 * fVar216 + fVar33 * auVar245._0_4_;
        fVar108 = fVar44 * fVar220 + fVar33 * auVar245._4_4_;
        fVar109 = fVar44 * fVar222 + fVar33 * auVar245._8_4_;
        fVar110 = fVar44 * fVar225 + fVar33 * auVar245._12_4_;
        fVar123 = fVar77 * fVar216 + fVar32 * auVar245._0_4_;
        fVar75 = fVar77 * fVar220 + fVar32 * auVar245._4_4_;
        fVar76 = fVar77 * fVar222 + fVar32 * auVar245._8_4_;
        fVar77 = fVar77 * fVar225 + fVar32 * auVar245._12_4_;
        fVar170 = fVar183 * fVar216 + fVar203 * auVar245._0_4_;
        fVar179 = fVar183 * fVar220 + fVar203 * auVar245._4_4_;
        fVar181 = fVar183 * fVar222 + fVar203 * auVar245._8_4_;
        fVar183 = fVar183 * fVar225 + fVar203 * auVar245._12_4_;
        fVar33 = fVar47 * fVar216 + fVar111 * auVar245._0_4_;
        fVar32 = fVar47 * fVar220 + fVar111 * auVar245._4_4_;
        fVar44 = fVar47 * fVar222 + fVar111 * auVar245._8_4_;
        fVar47 = fVar47 * fVar225 + fVar111 * auVar245._12_4_;
        fVar244 = fVar223 * fVar216 + fVar119 * auVar245._0_4_;
        fVar248 = fVar223 * fVar220 + fVar119 * auVar245._4_4_;
        fVar249 = fVar223 * fVar222 + fVar119 * auVar245._8_4_;
        fVar250 = fVar223 * fVar225 + fVar119 * auVar245._12_4_;
        fVar111 = fVar216 * fVar154 + fVar121 * auVar245._0_4_;
        fVar119 = fVar220 * fVar154 + fVar121 * auVar245._4_4_;
        fVar223 = fVar222 * fVar154 + fVar121 * auVar245._8_4_;
        fVar121 = fVar225 * fVar154 + fVar121 * auVar245._12_4_;
        auVar160._0_4_ = fVar208 * fVar170 - fVar227 * fVar123;
        auVar160._4_4_ = fVar210 * fVar179 - fVar235 * fVar75;
        auVar160._8_4_ = fVar212 * fVar181 - fVar238 * fVar76;
        auVar160._12_4_ = fVar214 * fVar183 - fVar241 * fVar77;
        auVar126._0_4_ = fVar227 * fVar78 - fVar112 * fVar170;
        auVar126._4_4_ = fVar235 * fVar108 - fVar120 * fVar179;
        auVar126._8_4_ = fVar238 * fVar109 - fVar122 * fVar181;
        auVar126._12_4_ = fVar241 * fVar110 - fVar124 * fVar183;
        auVar37._0_4_ = fVar112 * fVar123 - fVar208 * fVar78;
        auVar37._4_4_ = fVar120 * fVar75 - fVar210 * fVar108;
        auVar37._8_4_ = fVar122 * fVar76 - fVar212 * fVar109;
        auVar37._12_4_ = fVar124 * fVar77 - fVar214 * fVar110;
        auVar134._0_4_ = fVar193 * fVar123 - fVar202 * fVar170;
        auVar134._4_4_ = fVar196 * fVar75 - fVar205 * fVar179;
        auVar134._8_4_ = fVar198 * fVar76 - fVar206 * fVar181;
        auVar134._12_4_ = fVar200 * fVar77 - fVar207 * fVar183;
        auVar230._4_4_ = fVar179 * fVar149 - fVar196 * fVar108;
        auVar230._0_4_ = fVar170 * fVar144 - fVar193 * fVar78;
        auVar79._0_4_ = fVar78 * fVar202 - fVar123 * fVar144;
        auVar79._4_4_ = fVar108 * fVar205 - fVar75 * fVar149;
        auVar79._8_4_ = fVar109 * fVar206 - fVar76 * fVar151;
        auVar79._12_4_ = fVar110 * fVar207 - fVar77 * fVar153;
        auVar53._0_4_ = fVar202 * fVar227 - fVar193 * fVar208;
        auVar53._4_4_ = fVar205 * fVar235 - fVar196 * fVar210;
        auVar53._8_4_ = fVar206 * fVar238 - fVar198 * fVar212;
        auVar53._12_4_ = fVar207 * fVar241 - fVar200 * fVar214;
        auVar186._0_4_ = fVar193 * fVar112 - fVar227 * fVar144;
        auVar186._4_4_ = fVar196 * fVar120 - fVar235 * fVar149;
        auVar186._8_4_ = fVar198 * fVar122 - fVar238 * fVar151;
        auVar186._12_4_ = fVar200 * fVar124 - fVar241 * fVar153;
        auVar172._4_4_ = fVar210 * fVar149 - fVar120 * fVar205;
        auVar172._0_4_ = fVar208 * fVar144 - fVar112 * fVar202;
        auVar230._8_4_ = fVar181 * fVar151 - fVar198 * fVar109;
        auVar230._12_4_ = fVar183 * fVar153 - fVar200 * fVar110;
        auVar172._8_4_ = fVar212 * fVar151 - fVar122 * fVar206;
        auVar172._12_4_ = fVar214 * fVar153 - fVar124 * fVar207;
        auVar146._0_4_ =
             fVar144 * auVar160._0_4_ + fVar202 * auVar126._0_4_ + fVar193 * auVar37._0_4_;
        auVar146._4_4_ =
             fVar149 * auVar160._4_4_ + fVar205 * auVar126._4_4_ + fVar196 * auVar37._4_4_;
        auVar146._8_4_ =
             fVar151 * auVar160._8_4_ + fVar206 * auVar126._8_4_ + fVar198 * auVar37._8_4_;
        auVar146._12_4_ =
             fVar153 * auVar160._12_4_ + fVar207 * auVar126._12_4_ + fVar200 * auVar37._12_4_;
        auVar161 = divps(auVar160,auVar146);
        auVar135 = divps(auVar134,auVar146);
        auVar54 = divps(auVar53,auVar146);
        auVar127 = divps(auVar126,auVar146);
        auVar231 = divps(auVar230,auVar146);
        auVar187 = divps(auVar186,auVar146);
        auVar114 = divps(auVar37,auVar146);
        auVar36 = divps(auVar79,auVar146);
        auVar173 = divps(auVar172,auVar146);
        fVar123 = fVar33 * auVar161._0_4_ + fVar244 * auVar127._0_4_ + fVar111 * auVar114._0_4_;
        fVar77 = fVar32 * auVar161._4_4_ + fVar248 * auVar127._4_4_ + fVar119 * auVar114._4_4_;
        fVar183 = fVar44 * auVar161._8_4_ + fVar249 * auVar127._8_4_ + fVar223 * auVar114._8_4_;
        fVar154 = fVar47 * auVar161._12_4_ + fVar250 * auVar127._12_4_ + fVar121 * auVar114._12_4_;
        fVar203 = fVar33 * auVar135._0_4_ + fVar244 * auVar231._0_4_ + fVar111 * auVar36._0_4_;
        fVar75 = fVar32 * auVar135._4_4_ + fVar248 * auVar231._4_4_ + fVar119 * auVar36._4_4_;
        fVar76 = fVar44 * auVar135._8_4_ + fVar249 * auVar231._8_4_ + fVar223 * auVar36._8_4_;
        fVar78 = fVar47 * auVar135._12_4_ + fVar250 * auVar231._12_4_ + fVar121 * auVar36._12_4_;
        fVar33 = fVar33 * auVar54._0_4_ + fVar244 * auVar187._0_4_ + fVar111 * auVar173._0_4_;
        fVar32 = fVar32 * auVar54._4_4_ + fVar248 * auVar187._4_4_ + fVar119 * auVar173._4_4_;
        fVar111 = fVar44 * auVar54._8_4_ + fVar249 * auVar187._8_4_ + fVar223 * auVar173._8_4_;
        fVar119 = fVar47 * auVar54._12_4_ + fVar250 * auVar187._12_4_ + fVar121 * auVar173._12_4_;
      }
      else {
        while( true ) {
          uVar28 = movmskps((int)lVar23,auVar114);
          if (uVar28 == 0) break;
          lVar23 = 0;
          if ((uVar28 & 0xff) != 0) {
            for (; ((uVar28 & 0xff) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          iVar26 = *(int *)((long)&local_a8 + (long)(int)lVar23 * 4);
          lVar24 = (long)iVar26;
          auVar115._0_4_ = -(uint)(iVar26 == iVar157);
          auVar115._4_4_ = -(uint)(iVar26 == iVar164);
          auVar115._8_4_ = -(uint)(iVar26 == iVar166);
          auVar115._12_4_ = -(uint)(iVar26 == iVar168);
          auVar115 = auVar115 & auVar114;
          pAVar11 = pIVar9->local2world;
          lVar23 = lVar24 * 0x40;
          pAVar2 = pAVar11 + lVar24;
          uVar25 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar13 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          auVar139._4_4_ = uVar25;
          auVar139._0_4_ = uVar25;
          auVar139._8_4_ = uVar25;
          auVar139._12_4_ = uVar25;
          in_XMM4 = ~auVar115 & in_XMM4 | auVar139 & auVar115;
          auVar140._4_4_ = uVar13;
          auVar140._0_4_ = uVar13;
          auVar140._8_4_ = uVar13;
          auVar140._12_4_ = uVar13;
          auVar218 = ~auVar115 & auVar218 | auVar140 & auVar115;
          auVar129._4_4_ = uVar14;
          auVar129._0_4_ = uVar14;
          auVar129._8_4_ = uVar14;
          auVar129._12_4_ = uVar14;
          in_XMM9 = ~auVar115 & in_XMM9 | auVar129 & auVar115;
          pVVar3 = &pAVar11[lVar24].l.vy;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar141._4_4_ = uVar25;
          auVar141._0_4_ = uVar25;
          auVar141._8_4_ = uVar25;
          auVar141._12_4_ = uVar25;
          in_XMM12 = ~auVar115 & in_XMM12 | auVar141 & auVar115;
          auVar57._4_4_ = uVar13;
          auVar57._0_4_ = uVar13;
          auVar57._8_4_ = uVar13;
          auVar57._12_4_ = uVar13;
          auVar36 = ~auVar115 & auVar36 | auVar57 & auVar115;
          auVar58._4_4_ = uVar14;
          auVar58._0_4_ = uVar14;
          auVar58._8_4_ = uVar14;
          auVar58._12_4_ = uVar14;
          in_XMM11 = ~auVar115 & in_XMM11 | auVar58 & auVar115;
          pVVar3 = &pAVar11[lVar24].l.vz;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar82._4_4_ = uVar25;
          auVar82._0_4_ = uVar25;
          auVar82._8_4_ = uVar25;
          auVar82._12_4_ = uVar25;
          in_XMM8 = ~auVar115 & in_XMM8 | auVar82 & auVar115;
          auVar83._4_4_ = uVar13;
          auVar83._0_4_ = uVar13;
          auVar83._8_4_ = uVar13;
          auVar83._12_4_ = uVar13;
          in_XMM10 = ~auVar115 & in_XMM10 | auVar83 & auVar115;
          auVar59._4_4_ = uVar14;
          auVar59._0_4_ = uVar14;
          auVar59._8_4_ = uVar14;
          auVar59._12_4_ = uVar14;
          in_XMM14 = ~auVar115 & in_XMM14 | auVar59 & auVar115;
          pVVar3 = &pAVar11[lVar24].p;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar60._4_4_ = uVar25;
          auVar60._0_4_ = uVar25;
          auVar60._8_4_ = uVar25;
          auVar60._12_4_ = uVar25;
          auVar61._4_4_ = uVar13;
          auVar61._0_4_ = uVar13;
          auVar61._8_4_ = uVar13;
          auVar61._12_4_ = uVar13;
          _local_2b8 = ~auVar115 & _local_2b8 | auVar61 & auVar115;
          auVar39._4_4_ = uVar14;
          auVar39._0_4_ = uVar14;
          auVar39._8_4_ = uVar14;
          auVar39._12_4_ = uVar14;
          in_XMM6 = ~auVar115 & in_XMM6 | auVar39 & auVar115;
          pAVar2 = pAVar11 + lVar24 + 1;
          uVar25 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar13 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          auVar62._4_4_ = uVar25;
          auVar62._0_4_ = uVar25;
          auVar62._8_4_ = uVar25;
          auVar62._12_4_ = uVar25;
          _local_268 = ~auVar115 & _local_268 | auVar62 & auVar115;
          auVar63._4_4_ = uVar13;
          auVar63._0_4_ = uVar13;
          auVar63._8_4_ = uVar13;
          auVar63._12_4_ = uVar13;
          _local_228 = ~auVar115 & _local_228 | auVar63 & auVar115;
          auVar40._4_4_ = uVar14;
          auVar40._0_4_ = uVar14;
          auVar40._8_4_ = uVar14;
          auVar40._12_4_ = uVar14;
          _local_258 = ~auVar115 & _local_258 | auVar40 & auVar115;
          pVVar3 = &pAVar11[lVar24 + 1].l.vy;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar64._4_4_ = uVar25;
          auVar64._0_4_ = uVar25;
          auVar64._8_4_ = uVar25;
          auVar64._12_4_ = uVar25;
          _local_288 = ~auVar115 & _local_288 | auVar64 & auVar115;
          auVar65._4_4_ = uVar13;
          auVar65._0_4_ = uVar13;
          auVar65._8_4_ = uVar13;
          auVar65._12_4_ = uVar13;
          _local_1d8 = ~auVar115 & _local_1d8 | auVar65 & auVar115;
          auVar41._4_4_ = uVar14;
          auVar41._0_4_ = uVar14;
          auVar41._8_4_ = uVar14;
          auVar41._12_4_ = uVar14;
          _local_1c8 = ~auVar115 & _local_1c8 | auVar41 & auVar115;
          pVVar3 = &pAVar11[lVar24 + 1].l.vz;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar66._4_4_ = uVar25;
          auVar66._0_4_ = uVar25;
          auVar66._8_4_ = uVar25;
          auVar66._12_4_ = uVar25;
          _local_248 = ~auVar115 & _local_248 | auVar66 & auVar115;
          auVar67._4_4_ = uVar13;
          auVar67._0_4_ = uVar13;
          auVar67._8_4_ = uVar13;
          auVar67._12_4_ = uVar13;
          _local_278 = ~auVar115 & _local_278 | auVar67 & auVar115;
          auVar42._4_4_ = uVar14;
          auVar42._0_4_ = uVar14;
          auVar42._8_4_ = uVar14;
          auVar42._12_4_ = uVar14;
          _local_218 = ~auVar115 & _local_218 | auVar42 & auVar115;
          pVVar3 = &pAVar11[lVar24 + 1].p;
          uVar25 = *(undefined4 *)&pVVar3->field_0;
          uVar13 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar246._4_4_ = uVar25;
          auVar246._0_4_ = uVar25;
          auVar246._8_4_ = uVar25;
          auVar246._12_4_ = uVar25;
          _local_238 = ~auVar115 & _local_238 | auVar246 & auVar115;
          auVar232._4_4_ = uVar13;
          auVar232._0_4_ = uVar13;
          auVar232._8_4_ = uVar13;
          auVar232._12_4_ = uVar13;
          _local_298 = ~auVar115 & _local_298 | auVar232 & auVar115;
          auVar68._4_4_ = uVar14;
          auVar68._0_4_ = uVar14;
          auVar68._8_4_ = uVar14;
          auVar68._12_4_ = uVar14;
          _local_2a8 = ~auVar115 & _local_2a8 | auVar68 & auVar115;
          auVar114 = auVar114 ^ auVar115;
          auVar54 = ~auVar115 & auVar54 | auVar60 & auVar115;
        }
        fVar120 = 1.0 - auVar245._0_4_;
        fVar122 = 1.0 - auVar245._4_4_;
        fVar124 = 1.0 - auVar245._8_4_;
        fVar144 = 1.0 - auVar245._12_4_;
        fVar108 = in_XMM4._0_4_ * fVar120 + (float)local_268._0_4_ * auVar245._0_4_;
        fVar109 = in_XMM4._4_4_ * fVar122 + (float)local_268._4_4_ * auVar245._4_4_;
        fVar110 = in_XMM4._8_4_ * fVar124 + fStack_260 * auVar245._8_4_;
        fVar112 = in_XMM4._12_4_ * fVar144 + fStack_25c * auVar245._12_4_;
        fVar123 = auVar218._0_4_ * fVar120 + (float)local_228._0_4_ * auVar245._0_4_;
        fVar183 = auVar218._4_4_ * fVar122 + (float)local_228._4_4_ * auVar245._4_4_;
        fVar203 = auVar218._8_4_ * fVar124 + fStack_220 * auVar245._8_4_;
        fVar76 = auVar218._12_4_ * fVar144 + fStack_21c * auVar245._12_4_;
        fVar149 = in_XMM9._0_4_ * fVar120 + (float)local_258._0_4_ * auVar245._0_4_;
        fVar151 = in_XMM9._4_4_ * fVar122 + (float)local_258._4_4_ * auVar245._4_4_;
        fVar153 = in_XMM9._8_4_ * fVar124 + fStack_250 * auVar245._8_4_;
        fVar170 = in_XMM9._12_4_ * fVar144 + fStack_24c * auVar245._12_4_;
        fVar206 = in_XMM12._0_4_ * fVar120 + (float)local_288._0_4_ * auVar245._0_4_;
        fVar207 = in_XMM12._4_4_ * fVar122 + (float)local_288._4_4_ * auVar245._4_4_;
        fVar208 = in_XMM12._8_4_ * fVar124 + fStack_280 * auVar245._8_4_;
        fVar210 = in_XMM12._12_4_ * fVar144 + fStack_27c * auVar245._12_4_;
        fVar33 = auVar36._0_4_ * fVar120 + (float)local_1d8._0_4_ * auVar245._0_4_;
        fVar32 = auVar36._4_4_ * fVar122 + (float)local_1d8._4_4_ * auVar245._4_4_;
        fVar111 = auVar36._8_4_ * fVar124 + fStack_1d0 * auVar245._8_4_;
        fVar119 = auVar36._12_4_ * fVar144 + fStack_1cc * auVar245._12_4_;
        fVar198 = in_XMM11._0_4_ * fVar120 + (float)local_1c8._0_4_ * auVar245._0_4_;
        fVar200 = in_XMM11._4_4_ * fVar122 + (float)local_1c8._4_4_ * auVar245._4_4_;
        fVar202 = in_XMM11._8_4_ * fVar124 + fStack_1c0 * auVar245._8_4_;
        fVar205 = in_XMM11._12_4_ * fVar144 + fStack_1bc * auVar245._12_4_;
        fVar77 = in_XMM8._0_4_ * fVar120 + (float)local_248._0_4_ * auVar245._0_4_;
        fVar154 = in_XMM8._4_4_ * fVar122 + (float)local_248._4_4_ * auVar245._4_4_;
        fVar75 = in_XMM8._8_4_ * fVar124 + fStack_240 * auVar245._8_4_;
        fVar78 = in_XMM8._12_4_ * fVar144 + fStack_23c * auVar245._12_4_;
        fVar179 = in_XMM10._0_4_ * fVar120 + (float)local_278._0_4_ * auVar245._0_4_;
        fVar181 = in_XMM10._4_4_ * fVar122 + (float)local_278._4_4_ * auVar245._4_4_;
        fVar193 = in_XMM10._8_4_ * fVar124 + fStack_270 * auVar245._8_4_;
        fVar196 = in_XMM10._12_4_ * fVar144 + fStack_26c * auVar245._12_4_;
        fVar212 = in_XMM14._0_4_ * fVar120 + (float)local_218._0_4_ * auVar245._0_4_;
        fVar214 = in_XMM14._4_4_ * fVar122 + (float)local_218._4_4_ * auVar245._4_4_;
        fVar216 = in_XMM14._8_4_ * fVar124 + fStack_210 * auVar245._8_4_;
        fVar220 = in_XMM14._12_4_ * fVar144 + fStack_20c * auVar245._12_4_;
        fVar222 = auVar54._0_4_ * fVar120 + (float)local_238._0_4_ * auVar245._0_4_;
        fVar225 = auVar54._4_4_ * fVar122 + (float)local_238._4_4_ * auVar245._4_4_;
        fVar227 = auVar54._8_4_ * fVar124 + (float)uStack_230 * auVar245._8_4_;
        fVar235 = auVar54._12_4_ * fVar144 + uStack_230._4_4_ * auVar245._12_4_;
        fVar121 = (float)local_2b8._0_4_ * fVar120 + (float)local_298._0_4_ * auVar245._0_4_;
        fVar44 = (float)local_2b8._4_4_ * fVar122 + (float)local_298._4_4_ * auVar245._4_4_;
        fVar47 = (float)uStack_2b0 * fVar124 + (float)uStack_290 * auVar245._8_4_;
        fVar223 = uStack_2b0._4_4_ * fVar144 + uStack_290._4_4_ * auVar245._12_4_;
        fVar120 = fVar120 * in_XMM6._0_4_ + (float)local_2a8._0_4_ * auVar245._0_4_;
        fVar122 = fVar122 * in_XMM6._4_4_ + (float)local_2a8._4_4_ * auVar245._4_4_;
        fVar124 = fVar124 * in_XMM6._8_4_ + (float)uStack_2a0 * auVar245._8_4_;
        fVar144 = fVar144 * in_XMM6._12_4_ + uStack_2a0._4_4_ * auVar245._12_4_;
        auVar163._0_4_ = fVar33 * fVar212 - fVar198 * fVar179;
        auVar163._4_4_ = fVar32 * fVar214 - fVar200 * fVar181;
        auVar163._8_4_ = fVar111 * fVar216 - fVar202 * fVar193;
        auVar163._12_4_ = fVar119 * fVar220 - fVar205 * fVar196;
        auVar130._0_4_ = fVar198 * fVar77 - fVar206 * fVar212;
        auVar130._4_4_ = fVar200 * fVar154 - fVar207 * fVar214;
        auVar130._8_4_ = fVar202 * fVar75 - fVar208 * fVar216;
        auVar130._12_4_ = fVar205 * fVar78 - fVar210 * fVar220;
        auVar116._0_4_ = fVar206 * fVar179 - fVar33 * fVar77;
        auVar116._4_4_ = fVar207 * fVar181 - fVar32 * fVar154;
        auVar116._8_4_ = fVar208 * fVar193 - fVar111 * fVar75;
        auVar116._12_4_ = fVar210 * fVar196 - fVar119 * fVar78;
        auVar142._0_4_ = fVar149 * fVar179 - fVar123 * fVar212;
        auVar142._4_4_ = fVar151 * fVar181 - fVar183 * fVar214;
        auVar142._8_4_ = fVar153 * fVar193 - fVar203 * fVar216;
        auVar142._12_4_ = fVar170 * fVar196 - fVar76 * fVar220;
        auVar233._0_4_ = fVar212 * fVar108 - fVar149 * fVar77;
        auVar233._4_4_ = fVar214 * fVar109 - fVar151 * fVar154;
        auVar233._8_4_ = fVar216 * fVar110 - fVar153 * fVar75;
        auVar233._12_4_ = fVar220 * fVar112 - fVar170 * fVar78;
        auVar84._0_4_ = fVar77 * fVar123 - fVar179 * fVar108;
        auVar84._4_4_ = fVar154 * fVar183 - fVar181 * fVar109;
        auVar84._8_4_ = fVar75 * fVar203 - fVar193 * fVar110;
        auVar84._12_4_ = fVar78 * fVar76 - fVar196 * fVar112;
        auVar69._0_4_ = fVar123 * fVar198 - fVar149 * fVar33;
        auVar69._4_4_ = fVar183 * fVar200 - fVar151 * fVar32;
        auVar69._8_4_ = fVar203 * fVar202 - fVar153 * fVar111;
        auVar69._12_4_ = fVar76 * fVar205 - fVar170 * fVar119;
        auVar189._0_4_ = fVar149 * fVar206 - fVar198 * fVar108;
        auVar189._4_4_ = fVar151 * fVar207 - fVar200 * fVar109;
        auVar189._8_4_ = fVar153 * fVar208 - fVar202 * fVar110;
        auVar189._12_4_ = fVar170 * fVar210 - fVar205 * fVar112;
        auVar177._0_4_ = fVar33 * fVar108 - fVar206 * fVar123;
        auVar177._4_4_ = fVar32 * fVar109 - fVar207 * fVar183;
        auVar177._8_4_ = fVar111 * fVar110 - fVar208 * fVar203;
        auVar177._12_4_ = fVar119 * fVar112 - fVar210 * fVar76;
        auVar219._0_4_ =
             fVar108 * auVar163._0_4_ + fVar123 * auVar130._0_4_ + fVar149 * auVar116._0_4_;
        auVar219._4_4_ =
             fVar109 * auVar163._4_4_ + fVar183 * auVar130._4_4_ + fVar151 * auVar116._4_4_;
        auVar219._8_4_ =
             fVar110 * auVar163._8_4_ + fVar203 * auVar130._8_4_ + fVar153 * auVar116._8_4_;
        auVar219._12_4_ =
             fVar112 * auVar163._12_4_ + fVar76 * auVar130._12_4_ + fVar170 * auVar116._12_4_;
        auVar161 = divps(auVar163,auVar219);
        auVar135 = divps(auVar142,auVar219);
        auVar54 = divps(auVar69,auVar219);
        auVar127 = divps(auVar130,auVar219);
        auVar231 = divps(auVar233,auVar219);
        auVar187 = divps(auVar189,auVar219);
        auVar114 = divps(auVar116,auVar219);
        auVar36 = divps(auVar84,auVar219);
        auVar173 = divps(auVar177,auVar219);
        fVar123 = fVar222 * auVar161._0_4_ + fVar121 * auVar127._0_4_ + fVar120 * auVar114._0_4_;
        fVar77 = fVar225 * auVar161._4_4_ + fVar44 * auVar127._4_4_ + fVar122 * auVar114._4_4_;
        fVar183 = fVar227 * auVar161._8_4_ + fVar47 * auVar127._8_4_ + fVar124 * auVar114._8_4_;
        fVar154 = fVar235 * auVar161._12_4_ + fVar223 * auVar127._12_4_ + fVar144 * auVar114._12_4_;
        fVar203 = fVar222 * auVar135._0_4_ + fVar121 * auVar231._0_4_ + fVar120 * auVar36._0_4_;
        fVar75 = fVar225 * auVar135._4_4_ + fVar44 * auVar231._4_4_ + fVar122 * auVar36._4_4_;
        fVar76 = fVar227 * auVar135._8_4_ + fVar47 * auVar231._8_4_ + fVar124 * auVar36._8_4_;
        fVar78 = fVar235 * auVar135._12_4_ + fVar223 * auVar231._12_4_ + fVar144 * auVar36._12_4_;
        fVar33 = fVar222 * auVar54._0_4_ + fVar121 * auVar187._0_4_ + fVar120 * auVar173._0_4_;
        fVar32 = fVar225 * auVar54._4_4_ + fVar44 * auVar187._4_4_ + fVar122 * auVar173._4_4_;
        fVar111 = fVar227 * auVar54._8_4_ + fVar47 * auVar187._8_4_ + fVar124 * auVar173._8_4_;
        fVar119 = fVar235 * auVar54._12_4_ + fVar223 * auVar187._12_4_ + fVar144 * auVar173._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar121 = *(float *)pRVar1;
    fVar44 = *(float *)(ray + 0x14);
    fVar47 = *(float *)(ray + 0x18);
    auVar17 = *(undefined1 (*) [12])pRVar1;
    fVar223 = *(float *)(ray + 0x1c);
    auVar70 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar108 = *(float *)pRVar1;
    fVar109 = *(float *)(ray + 0x24);
    fVar110 = *(float *)(ray + 0x28);
    auVar18 = *(undefined1 (*) [12])pRVar1;
    fVar112 = *(float *)(ray + 0x2c);
    auVar71 = *(undefined1 (*) [16])pRVar1;
    fVar120 = *(float *)ray;
    fVar122 = *(float *)(ray + 4);
    fVar124 = *(float *)(ray + 8);
    auVar19 = *(undefined1 (*) [12])ray;
    fVar144 = *(float *)(ray + 0xc);
    auVar72 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar149 = *(float *)pRVar1;
    fVar151 = *(float *)(ray + 0x44);
    fVar153 = *(float *)(ray + 0x48);
    auVar22 = *(undefined1 (*) [12])pRVar1;
    fVar170 = *(float *)(ray + 0x4c);
    auVar86 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar179 = *(float *)pRVar1;
    fVar181 = *(float *)(ray + 0x54);
    fVar193 = *(float *)(ray + 0x58);
    auVar21 = *(undefined1 (*) [12])pRVar1;
    fVar196 = *(float *)(ray + 0x5c);
    auVar85 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar198 = *(float *)pRVar1;
    fVar200 = *(float *)(ray + 100);
    fVar202 = *(float *)(ray + 0x68);
    auVar20 = *(undefined1 (*) [12])pRVar1;
    fVar205 = *(float *)(ray + 0x6c);
    auVar73 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar161._0_4_ * fVar120 + auVar127._0_4_ * fVar121 + auVar114._0_4_ * fVar108 + -fVar123;
    *(float *)(ray + 4) =
         auVar161._4_4_ * fVar122 + auVar127._4_4_ * fVar44 + auVar114._4_4_ * fVar109 + -fVar77;
    *(float *)(ray + 8) =
         auVar161._8_4_ * fVar124 + auVar127._8_4_ * fVar47 + auVar114._8_4_ * fVar110 + -fVar183;
    *(float *)(ray + 0xc) =
         auVar161._12_4_ * fVar144 +
         auVar127._12_4_ * fVar223 + auVar114._12_4_ * fVar112 + -fVar154;
    *(float *)(ray + 0x10) =
         auVar135._0_4_ * fVar120 + auVar231._0_4_ * fVar121 + auVar36._0_4_ * fVar108 + -fVar203;
    *(float *)(ray + 0x14) =
         auVar135._4_4_ * fVar122 + auVar231._4_4_ * fVar44 + auVar36._4_4_ * fVar109 + -fVar75;
    *(float *)(ray + 0x18) =
         auVar135._8_4_ * fVar124 + auVar231._8_4_ * fVar47 + auVar36._8_4_ * fVar110 + -fVar76;
    *(float *)(ray + 0x1c) =
         auVar135._12_4_ * fVar144 + auVar231._12_4_ * fVar223 + auVar36._12_4_ * fVar112 + -fVar78;
    *(float *)(ray + 0x20) =
         auVar54._0_4_ * fVar120 + auVar187._0_4_ * fVar121 + auVar173._0_4_ * fVar108 + -fVar33;
    *(float *)(ray + 0x24) =
         auVar54._4_4_ * fVar122 + auVar187._4_4_ * fVar44 + auVar173._4_4_ * fVar109 + -fVar32;
    *(float *)(ray + 0x28) =
         auVar54._8_4_ * fVar124 + auVar187._8_4_ * fVar47 + auVar173._8_4_ * fVar110 + -fVar111;
    *(float *)(ray + 0x2c) =
         auVar54._12_4_ * fVar144 + auVar187._12_4_ * fVar223 + auVar173._12_4_ * fVar112 + -fVar119
    ;
    *(float *)(ray + 0x40) =
         auVar161._0_4_ * fVar149 + auVar127._0_4_ * fVar179 + auVar114._0_4_ * fVar198;
    *(float *)(ray + 0x44) =
         auVar161._4_4_ * fVar151 + auVar127._4_4_ * fVar181 + auVar114._4_4_ * fVar200;
    *(float *)(ray + 0x48) =
         auVar161._8_4_ * fVar153 + auVar127._8_4_ * fVar193 + auVar114._8_4_ * fVar202;
    *(float *)(ray + 0x4c) =
         auVar161._12_4_ * fVar170 + auVar127._12_4_ * fVar196 + auVar114._12_4_ * fVar205;
    *(float *)(ray + 0x50) =
         auVar135._0_4_ * fVar149 + auVar231._0_4_ * fVar179 + auVar36._0_4_ * fVar198;
    *(float *)(ray + 0x54) =
         auVar135._4_4_ * fVar151 + auVar231._4_4_ * fVar181 + auVar36._4_4_ * fVar200;
    *(float *)(ray + 0x58) =
         auVar135._8_4_ * fVar153 + auVar231._8_4_ * fVar193 + auVar36._8_4_ * fVar202;
    *(float *)(ray + 0x5c) =
         auVar135._12_4_ * fVar170 + auVar231._12_4_ * fVar196 + auVar36._12_4_ * fVar205;
    *(float *)(ray + 0x60) =
         auVar54._0_4_ * fVar149 + auVar187._0_4_ * fVar179 + auVar173._0_4_ * fVar198;
    *(float *)(ray + 100) =
         auVar54._4_4_ * fVar151 + auVar187._4_4_ * fVar181 + auVar173._4_4_ * fVar200;
    *(float *)(ray + 0x68) =
         auVar54._8_4_ * fVar153 + auVar187._8_4_ * fVar193 + auVar173._8_4_ * fVar202;
    *(float *)(ray + 0x6c) =
         auVar54._12_4_ * fVar170 + auVar187._12_4_ * fVar196 + auVar173._12_4_ * fVar205;
    local_a8 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    local_98 = context->args;
    local_c8 = auVar50._0_8_;
    uStack_c0 = auVar50._8_8_;
    local_38 = local_c8;
    uStack_30 = uStack_c0;
    uStack_a0 = pRVar10;
    (**(code **)(local_a8 + 0x98))(&local_38,local_a8 + 0x58,ray);
    local_2b8 = auVar19._0_8_;
    uStack_2b0 = auVar72._8_8_;
    *(undefined1 (*) [8])ray = local_2b8;
    *(undefined8 *)(ray + 8) = uStack_2b0;
    local_2d8 = auVar17._0_8_;
    uStack_2d0 = auVar70._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_2d8;
    *(undefined8 *)(ray + 0x18) = uStack_2d0;
    local_2c8 = auVar18._0_8_;
    uStack_2c0 = auVar71._8_8_;
    *(undefined8 *)(ray + 0x20) = local_2c8;
    *(undefined8 *)(ray + 0x28) = uStack_2c0;
    local_238 = auVar22._0_8_;
    uStack_230 = auVar86._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_238;
    *(undefined8 *)(ray + 0x48) = uStack_230;
    local_298 = auVar21._0_8_;
    uStack_290 = auVar85._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_298;
    *(undefined8 *)(ray + 0x58) = uStack_290;
    local_2a8 = auVar20._0_8_;
    uStack_2a0 = auVar73._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_2a8;
    *(undefined8 *)(ray + 0x68) = uStack_2a0;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }